

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int iVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  long lVar70;
  byte bVar71;
  uint uVar72;
  ulong uVar73;
  long lVar74;
  float fVar75;
  vint4 bi_2;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined4 uVar76;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 extraout_var [56];
  vint4 bi;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar156;
  float fVar157;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar158;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  vint4 ai_2;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar194;
  vint4 ai_1;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar195;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined8 uVar196;
  float fVar218;
  vint4 ai;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar210 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar217;
  float fVar219;
  undefined1 auVar216 [32];
  float fVar223;
  float fVar243;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  float fVar244;
  float fVar264;
  float fVar266;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar268;
  undefined1 auVar249 [16];
  float fVar265;
  float fVar267;
  float fVar269;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar252 [16];
  undefined1 auVar263 [32];
  float fVar270;
  float fVar280;
  __m128 a;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [32];
  float fVar294;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar295;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [32];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar323 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  float fVar334;
  float fVar343;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_658 [16];
  undefined1 local_638 [8];
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5d8 [8];
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 uStack_5c0;
  float local_5b8;
  float fStack_5b4;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  float local_498;
  float fStack_494;
  float fStack_490;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 *local_448;
  Primitive *local_440;
  RTCFilterFunctionNArguments local_438;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  uint auStack_3a8 [4];
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [32];
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar69;
  undefined1 auVar120 [64];
  undefined1 auVar153 [32];
  
  PVar6 = prim[1];
  uVar68 = (ulong)(byte)PVar6;
  lVar70 = uVar68 * 0x25;
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar75 = *(float *)(prim + lVar70 + 0x12);
  auVar15 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar70 + 6));
  auVar77._0_4_ = fVar75 * auVar15._0_4_;
  auVar77._4_4_ = fVar75 * auVar15._4_4_;
  auVar77._8_4_ = fVar75 * auVar15._8_4_;
  auVar77._12_4_ = fVar75 * auVar15._12_4_;
  auVar121._0_4_ = fVar75 * auVar16._0_4_;
  auVar121._4_4_ = fVar75 * auVar16._4_4_;
  auVar121._8_4_ = fVar75 * auVar16._8_4_;
  auVar121._12_4_ = fVar75 * auVar16._12_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 4 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 6 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0xf + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar184 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar68 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1a + 6)));
  auVar184 = vcvtdq2ps_avx(auVar184);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1b + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar68 * 0x1c + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar335._4_4_ = auVar121._0_4_;
  auVar335._0_4_ = auVar121._0_4_;
  auVar335._8_4_ = auVar121._0_4_;
  auVar335._12_4_ = auVar121._0_4_;
  auVar21 = vshufps_avx(auVar121,auVar121,0x55);
  auVar124 = vshufps_avx(auVar121,auVar121,0xaa);
  fVar75 = auVar124._0_4_;
  auVar281._0_4_ = fVar75 * auVar95._0_4_;
  fVar178 = auVar124._4_4_;
  auVar281._4_4_ = fVar178 * auVar95._4_4_;
  fVar194 = auVar124._8_4_;
  auVar281._8_4_ = fVar194 * auVar95._8_4_;
  fVar138 = auVar124._12_4_;
  auVar281._12_4_ = fVar138 * auVar95._12_4_;
  auVar271._0_4_ = auVar184._0_4_ * fVar75;
  auVar271._4_4_ = auVar184._4_4_ * fVar178;
  auVar271._8_4_ = auVar184._8_4_ * fVar194;
  auVar271._12_4_ = auVar184._12_4_ * fVar138;
  auVar245._0_4_ = auVar106._0_4_ * fVar75;
  auVar245._4_4_ = auVar106._4_4_ * fVar178;
  auVar245._8_4_ = auVar106._8_4_ * fVar194;
  auVar245._12_4_ = auVar106._12_4_ * fVar138;
  auVar124 = vfmadd231ps_fma(auVar281,auVar21,auVar16);
  auVar141 = vfmadd231ps_fma(auVar271,auVar21,auVar18);
  auVar21 = vfmadd231ps_fma(auVar245,auVar20,auVar21);
  auVar79 = vfmadd231ps_fma(auVar124,auVar335,auVar15);
  auVar141 = vfmadd231ps_fma(auVar141,auVar335,auVar17);
  auVar80 = vfmadd231ps_fma(auVar21,auVar19,auVar335);
  auVar336._4_4_ = auVar77._0_4_;
  auVar336._0_4_ = auVar77._0_4_;
  auVar336._8_4_ = auVar77._0_4_;
  auVar336._12_4_ = auVar77._0_4_;
  auVar21 = vshufps_avx(auVar77,auVar77,0x55);
  auVar124 = vshufps_avx(auVar77,auVar77,0xaa);
  fVar75 = auVar124._0_4_;
  auVar255._0_4_ = fVar75 * auVar95._0_4_;
  fVar178 = auVar124._4_4_;
  auVar255._4_4_ = fVar178 * auVar95._4_4_;
  fVar194 = auVar124._8_4_;
  auVar255._8_4_ = fVar194 * auVar95._8_4_;
  fVar138 = auVar124._12_4_;
  auVar255._12_4_ = fVar138 * auVar95._12_4_;
  auVar98._0_4_ = auVar184._0_4_ * fVar75;
  auVar98._4_4_ = auVar184._4_4_ * fVar178;
  auVar98._8_4_ = auVar184._8_4_ * fVar194;
  auVar98._12_4_ = auVar184._12_4_ * fVar138;
  auVar78._0_4_ = auVar106._0_4_ * fVar75;
  auVar78._4_4_ = auVar106._4_4_ * fVar178;
  auVar78._8_4_ = auVar106._8_4_ * fVar194;
  auVar78._12_4_ = auVar106._12_4_ * fVar138;
  auVar16 = vfmadd231ps_fma(auVar255,auVar21,auVar16);
  auVar95 = vfmadd231ps_fma(auVar98,auVar21,auVar18);
  auVar18 = vfmadd231ps_fma(auVar78,auVar21,auVar20);
  auVar98 = vfmadd231ps_fma(auVar16,auVar336,auVar15);
  auVar99 = vfmadd231ps_fma(auVar95,auVar336,auVar17);
  auVar344._8_4_ = 0x7fffffff;
  auVar344._0_8_ = 0x7fffffff7fffffff;
  auVar344._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(auVar79,auVar344);
  auVar224._8_4_ = 0x219392ef;
  auVar224._0_8_ = 0x219392ef219392ef;
  auVar224._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar224,1);
  auVar16 = vblendvps_avx(auVar79,auVar224,auVar15);
  auVar15 = vandps_avx(auVar141,auVar344);
  auVar15 = vcmpps_avx(auVar15,auVar224,1);
  auVar95 = vblendvps_avx(auVar141,auVar224,auVar15);
  auVar15 = vandps_avx(auVar80,auVar344);
  auVar15 = vcmpps_avx(auVar15,auVar224,1);
  auVar15 = vblendvps_avx(auVar80,auVar224,auVar15);
  auVar100 = vfmadd231ps_fma(auVar18,auVar336,auVar19);
  auVar17 = vrcpps_avx(auVar16);
  auVar225._8_4_ = 0x3f800000;
  auVar225._0_8_ = &DAT_3f8000003f800000;
  auVar225._12_4_ = 0x3f800000;
  auVar16 = vfnmadd213ps_fma(auVar16,auVar17,auVar225);
  auVar79 = vfmadd132ps_fma(auVar16,auVar17,auVar17);
  auVar16 = vrcpps_avx(auVar95);
  auVar95 = vfnmadd213ps_fma(auVar95,auVar16,auVar225);
  auVar80 = vfmadd132ps_fma(auVar95,auVar16,auVar16);
  auVar16 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar16,auVar225);
  auVar77 = vfmadd132ps_fma(auVar15,auVar16,auVar16);
  fVar75 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar70 + 0x16)) *
           *(float *)(prim + lVar70 + 0x1a);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar68 * 7 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar189._4_4_ = fVar75;
  auVar189._0_4_ = fVar75;
  auVar189._8_4_ = fVar75;
  auVar189._12_4_ = fVar75;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar68 * 0xb + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar78 = vfmadd213ps_fma(auVar16,auVar189,auVar15);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar68 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar95);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar68 * 0xd + 6);
  auVar16 = vpmovsxwd_avx(auVar17);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar95 = vfmadd213ps_fma(auVar16,auVar189,auVar15);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar68 * 0x12 + 6);
  auVar15 = vpmovsxwd_avx(auVar18);
  uVar73 = (ulong)(uint)((int)(uVar68 * 5) << 2);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar68 * 2 + uVar73 + 6);
  auVar16 = vpmovsxwd_avx(auVar184);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar17 = vfmadd213ps_fma(auVar16,auVar189,auVar15);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar15 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar68 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar20);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar18 = vfmadd213ps_fma(auVar16,auVar189,auVar15);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar68 * 0x1d + 6);
  auVar15 = vpmovsxwd_avx(auVar106);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar68 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar16 = vpmovsxwd_avx(auVar21);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar184 = vfmadd213ps_fma(auVar16,auVar189,auVar15);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar68) + 6);
  auVar15 = vpmovsxwd_avx(auVar124);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar68 * 0x23 + 6);
  auVar16 = vpmovsxwd_avx(auVar141);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar15);
  auVar16 = vfmadd213ps_fma(auVar16,auVar189,auVar15);
  auVar15 = vsubps_avx(auVar78,auVar98);
  auVar197._0_4_ = auVar79._0_4_ * auVar15._0_4_;
  auVar197._4_4_ = auVar79._4_4_ * auVar15._4_4_;
  auVar197._8_4_ = auVar79._8_4_ * auVar15._8_4_;
  auVar197._12_4_ = auVar79._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar95,auVar98);
  auVar122._0_4_ = auVar79._0_4_ * auVar15._0_4_;
  auVar122._4_4_ = auVar79._4_4_ * auVar15._4_4_;
  auVar122._8_4_ = auVar79._8_4_ * auVar15._8_4_;
  auVar122._12_4_ = auVar79._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar17,auVar99);
  auVar168._0_4_ = auVar80._0_4_ * auVar15._0_4_;
  auVar168._4_4_ = auVar80._4_4_ * auVar15._4_4_;
  auVar168._8_4_ = auVar80._8_4_ * auVar15._8_4_;
  auVar168._12_4_ = auVar80._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar18,auVar99);
  auVar99._0_4_ = auVar80._0_4_ * auVar15._0_4_;
  auVar99._4_4_ = auVar80._4_4_ * auVar15._4_4_;
  auVar99._8_4_ = auVar80._8_4_ * auVar15._8_4_;
  auVar99._12_4_ = auVar80._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar184,auVar100);
  auVar159._0_4_ = auVar77._0_4_ * auVar15._0_4_;
  auVar159._4_4_ = auVar77._4_4_ * auVar15._4_4_;
  auVar159._8_4_ = auVar77._8_4_ * auVar15._8_4_;
  auVar159._12_4_ = auVar77._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar16,auVar100);
  auVar79._0_4_ = auVar77._0_4_ * auVar15._0_4_;
  auVar79._4_4_ = auVar77._4_4_ * auVar15._4_4_;
  auVar79._8_4_ = auVar77._8_4_ * auVar15._8_4_;
  auVar79._12_4_ = auVar77._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar197,auVar122);
  auVar16 = vpminsd_avx(auVar168,auVar99);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vpminsd_avx(auVar159,auVar79);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar246._4_4_ = uVar76;
  auVar246._0_4_ = uVar76;
  auVar246._8_4_ = uVar76;
  auVar246._12_4_ = uVar76;
  auVar16 = vmaxps_avx(auVar16,auVar246);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  local_378._0_4_ = auVar15._0_4_ * 0.99999964;
  local_378._4_4_ = auVar15._4_4_ * 0.99999964;
  local_378._8_4_ = auVar15._8_4_ * 0.99999964;
  local_378._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar197,auVar122);
  auVar16 = vpmaxsd_avx(auVar168,auVar99);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar16 = vpmaxsd_avx(auVar159,auVar79);
  uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar123._4_4_ = uVar76;
  auVar123._0_4_ = uVar76;
  auVar123._8_4_ = uVar76;
  auVar123._12_4_ = uVar76;
  auVar16 = vminps_avx(auVar16,auVar123);
  auVar15 = vminps_avx(auVar15,auVar16);
  auVar80._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar80._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar80._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar80._12_4_ = auVar15._12_4_ * 1.0000004;
  auVar100._1_3_ = 0;
  auVar100[0] = PVar6;
  auVar100[4] = PVar6;
  auVar100._5_3_ = 0;
  auVar100[8] = PVar6;
  auVar100._9_3_ = 0;
  auVar100[0xc] = PVar6;
  auVar100._13_3_ = 0;
  auVar16 = vpcmpgtd_avx(auVar100,_DAT_01ff0cf0);
  auVar15 = vcmpps_avx(local_378,auVar80,2);
  auVar15 = vandps_avx(auVar15,auVar16);
  uVar64 = vmovmskps_avx(auVar15);
  if (uVar64 == 0) {
    return;
  }
  uVar64 = uVar64 & 0xff;
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_288 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  local_448 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_440 = prim;
LAB_017e7daa:
  lVar70 = 0;
  for (uVar68 = (ulong)uVar64; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar70 = lVar70 + 1;
  }
  uVar67 = *(uint *)(local_440 + 2);
  uVar7 = *(uint *)(local_440 + lVar70 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar67].ptr;
  fVar75 = (pGVar8->time_range).lower;
  fVar194 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar75) / ((pGVar8->time_range).upper - fVar75));
  auVar15 = vroundss_avx(ZEXT416((uint)fVar194),ZEXT416((uint)fVar194),9);
  auVar15 = vminss_avx(auVar15,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar21 = vmaxss_avx(ZEXT816(0),auVar15);
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar74 = (long)(int)auVar21._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar74);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar74);
  auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar68);
  lVar70 = uVar68 + 1;
  auVar16 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar70);
  lVar1 = uVar68 + 2;
  auVar95 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar68 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar62 = *pauVar3;
  fVar75 = *(float *)pauVar3[1];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar74);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar74);
  auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar68);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar70);
  auVar184 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar178 = *pfVar4;
  fVar138 = pfVar4[1];
  fVar195 = pfVar4[2];
  fVar137 = pfVar4[3];
  auVar320._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar320._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar320._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar320._12_4_ = fVar75 * 0.0;
  auVar307._8_4_ = 0x3f000000;
  auVar307._0_8_ = 0x3f0000003f000000;
  auVar307._12_4_ = 0x3f000000;
  auVar19 = vfmadd231ps_fma(auVar320,auVar95,auVar307);
  auVar19 = vfmadd231ps_fma(auVar19,auVar16,ZEXT816(0) << 0x40);
  auVar122 = vfnmadd231ps_fma(auVar19,auVar15,auVar307);
  auVar198._8_4_ = 0x80000000;
  auVar198._0_8_ = 0x8000000080000000;
  auVar198._12_4_ = 0x80000000;
  auVar247._0_4_ = fVar178 * -0.0;
  auVar247._4_4_ = fVar138 * -0.0;
  auVar247._8_4_ = fVar195 * -0.0;
  auVar247._12_4_ = fVar137 * -0.0;
  auVar19 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar184,auVar247);
  auVar226._0_4_ = auVar18._0_4_ + auVar19._0_4_;
  auVar226._4_4_ = auVar18._4_4_ + auVar19._4_4_;
  auVar226._8_4_ = auVar18._8_4_ + auVar19._8_4_;
  auVar226._12_4_ = auVar18._12_4_ + auVar19._12_4_;
  auVar19 = vfmadd231ps_fma(auVar226,auVar17,auVar198);
  auVar124 = ZEXT816(0) << 0x20;
  auVar199._0_4_ = fVar178 * 0.0;
  auVar199._4_4_ = fVar138 * 0.0;
  auVar199._8_4_ = fVar195 * 0.0;
  auVar199._12_4_ = fVar137 * 0.0;
  auVar20 = vfmadd231ps_fma(auVar199,auVar184,auVar307);
  auVar20 = vfmadd231ps_fma(auVar20,auVar18,auVar124);
  auVar106 = vfnmadd231ps_fma(auVar20,auVar17,auVar307);
  auVar299._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar299._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar299._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar299._12_4_ = fVar75 * 0.5;
  auVar20 = vfmadd231ps_fma(auVar299,auVar124,auVar95);
  auVar20 = vfnmadd231ps_fma(auVar20,auVar307,auVar16);
  auVar79 = vfmadd231ps_fma(auVar20,auVar124,auVar15);
  auVar248._0_4_ = auVar247._0_4_ + auVar184._0_4_;
  auVar248._4_4_ = auVar247._4_4_ + auVar184._4_4_;
  auVar248._8_4_ = auVar247._8_4_ + auVar184._8_4_;
  auVar248._12_4_ = auVar247._12_4_ + auVar184._12_4_;
  auVar20 = vfmadd231ps_fma(auVar248,auVar18,auVar124);
  auVar139._8_4_ = 0x80000000;
  auVar139._0_8_ = 0x8000000080000000;
  auVar139._12_4_ = 0x80000000;
  auVar20 = vfmadd231ps_fma(auVar20,auVar17,auVar139);
  auVar179._0_4_ = fVar178 * 0.5;
  auVar179._4_4_ = fVar138 * 0.5;
  auVar179._8_4_ = fVar195 * 0.5;
  auVar179._12_4_ = fVar137 * 0.5;
  auVar184 = vfmadd231ps_fma(auVar179,auVar124,auVar184);
  auVar18 = vfnmadd231ps_fma(auVar184,auVar307,auVar18);
  auVar184 = vfmadd231ps_fma(auVar18,auVar124,auVar17);
  auVar17 = vshufps_avx(auVar122,auVar122,0xc9);
  auVar18 = vshufps_avx(auVar19,auVar19,0xc9);
  fVar221 = auVar122._0_4_;
  auVar101._0_4_ = fVar221 * auVar18._0_4_;
  fVar298 = auVar122._4_4_;
  auVar101._4_4_ = fVar298 * auVar18._4_4_;
  fVar222 = auVar122._8_4_;
  auVar101._8_4_ = fVar222 * auVar18._8_4_;
  fVar223 = auVar122._12_4_;
  auVar101._12_4_ = fVar223 * auVar18._12_4_;
  auVar80 = vfmsub231ps_fma(auVar101,auVar17,auVar19);
  auVar18 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar102._0_4_ = fVar221 * auVar18._0_4_;
  auVar102._4_4_ = fVar298 * auVar18._4_4_;
  auVar102._8_4_ = fVar222 * auVar18._8_4_;
  auVar102._12_4_ = fVar223 * auVar18._12_4_;
  auVar77 = vfmsub231ps_fma(auVar102,auVar17,auVar106);
  auVar17 = vshufps_avx(auVar79,auVar79,0xc9);
  auVar18 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar219 = auVar79._0_4_;
  auVar103._0_4_ = fVar219 * auVar18._0_4_;
  fVar296 = auVar79._4_4_;
  auVar103._4_4_ = fVar296 * auVar18._4_4_;
  fVar220 = auVar79._8_4_;
  auVar103._8_4_ = fVar220 * auVar18._8_4_;
  fVar297 = auVar79._12_4_;
  auVar103._12_4_ = fVar297 * auVar18._12_4_;
  auVar78 = vfmsub231ps_fma(auVar103,auVar17,auVar20);
  auVar18 = vshufps_avx(auVar184,auVar184,0xc9);
  auVar104._0_4_ = fVar219 * auVar18._0_4_;
  auVar104._4_4_ = fVar296 * auVar18._4_4_;
  auVar104._8_4_ = fVar220 * auVar18._8_4_;
  auVar104._12_4_ = fVar297 * auVar18._12_4_;
  auVar98 = vfmsub231ps_fma(auVar104,auVar17,auVar184);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar74);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar74);
  auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar70);
  auVar18 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
  auVar63 = *pauVar3;
  fVar137 = *(float *)pauVar3[1];
  lVar13 = *(long *)(lVar10 + 0x38 + lVar74);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar74);
  auVar282._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar282._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar282._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar282._12_4_ = fVar137 * 0.0;
  auVar184 = vfmadd231ps_fma(auVar282,auVar18,auVar307);
  auVar19 = vfmadd231ps_fma(auVar184,auVar17,auVar124);
  auVar184 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar68);
  auVar123 = vfnmadd231ps_fma(auVar19,auVar184,auVar307);
  auVar19 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
  pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
  fVar178 = *pfVar4;
  fVar138 = pfVar4[1];
  fVar195 = pfVar4[2];
  fVar136 = pfVar4[3];
  auVar227._8_4_ = 0x80000000;
  auVar227._0_8_ = 0x8000000080000000;
  auVar227._12_4_ = 0x80000000;
  auVar140._0_4_ = fVar178 * -0.0;
  auVar140._4_4_ = fVar138 * -0.0;
  auVar140._8_4_ = fVar195 * -0.0;
  auVar140._12_4_ = fVar136 * -0.0;
  auVar106 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar19,auVar140);
  auVar20 = *(undefined1 (*) [16])(lVar13 + lVar70 * lVar10);
  auVar180._0_4_ = auVar20._0_4_ + auVar106._0_4_;
  auVar180._4_4_ = auVar20._4_4_ + auVar106._4_4_;
  auVar180._8_4_ = auVar20._8_4_ + auVar106._8_4_;
  auVar180._12_4_ = auVar20._12_4_ + auVar106._12_4_;
  auVar106 = *(undefined1 (*) [16])(lVar13 + uVar68 * lVar10);
  auVar141 = vfmadd231ps_fma(auVar180,auVar106,auVar227);
  auVar124 = vshufps_avx(auVar141,auVar141,0xc9);
  fVar217 = auVar123._0_4_;
  auVar81._0_4_ = fVar217 * auVar124._0_4_;
  fVar294 = auVar123._4_4_;
  auVar81._4_4_ = fVar294 * auVar124._4_4_;
  fVar218 = auVar123._8_4_;
  auVar81._8_4_ = fVar218 * auVar124._8_4_;
  fVar295 = auVar123._12_4_;
  auVar81._12_4_ = fVar295 * auVar124._12_4_;
  auVar124 = vshufps_avx(auVar123,auVar123,0xc9);
  auVar99 = vfmsub231ps_fma(auVar81,auVar124,auVar141);
  auVar82._0_4_ = fVar178 * 0.0;
  auVar82._4_4_ = fVar138 * 0.0;
  auVar82._8_4_ = fVar195 * 0.0;
  auVar82._12_4_ = fVar136 * 0.0;
  auVar160._8_4_ = 0x3f000000;
  auVar160._0_8_ = 0x3f0000003f000000;
  auVar160._12_4_ = 0x3f000000;
  auVar141 = vfmadd231ps_fma(auVar82,auVar19,auVar160);
  auVar141 = vfmadd231ps_fma(auVar141,auVar20,ZEXT816(0) << 0x20);
  auVar100 = vfnmadd231ps_fma(auVar141,auVar106,auVar160);
  auVar141 = vshufps_avx(auVar100,auVar100,0xc9);
  auVar181._0_4_ = fVar217 * auVar141._0_4_;
  auVar181._4_4_ = fVar294 * auVar141._4_4_;
  auVar181._8_4_ = fVar218 * auVar141._8_4_;
  auVar181._12_4_ = fVar295 * auVar141._12_4_;
  auVar100 = vfmsub231ps_fma(auVar181,auVar124,auVar100);
  auVar83._0_4_ = auVar19._0_4_ + auVar140._0_4_;
  auVar83._4_4_ = auVar19._4_4_ + auVar140._4_4_;
  auVar83._8_4_ = auVar19._8_4_ + auVar140._8_4_;
  auVar83._12_4_ = auVar19._12_4_ + auVar140._12_4_;
  auVar105._0_4_ = fVar178 * 0.5;
  auVar105._4_4_ = fVar138 * 0.5;
  auVar105._8_4_ = fVar195 * 0.5;
  auVar105._12_4_ = fVar136 * 0.5;
  auVar141 = ZEXT416(0) << 0x20;
  auVar19 = vfmadd231ps_fma(auVar105,auVar141,auVar19);
  auVar124 = vfmadd231ps_fma(auVar83,auVar20,auVar141);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar160,auVar20);
  auVar20 = vfmadd231ps_fma(auVar124,auVar106,auVar227);
  auVar106 = vfmadd231ps_fma(auVar19,auVar141,auVar106);
  auVar345._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar345._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar345._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar345._12_4_ = fVar137 * 0.5;
  auVar19 = vfmadd231ps_fma(auVar345,auVar141,auVar18);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar160,auVar17);
  auVar124 = vfmadd231ps_fma(auVar19,auVar141,auVar184);
  auVar53._12_4_ = 0;
  auVar53._0_12_ = ZEXT812(0);
  auVar19 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar243 = auVar124._0_4_;
  auVar142._0_4_ = fVar243 * auVar19._0_4_;
  fVar270 = auVar124._4_4_;
  auVar142._4_4_ = fVar270 * auVar19._4_4_;
  fVar280 = auVar124._8_4_;
  auVar142._8_4_ = fVar280 * auVar19._8_4_;
  fVar334 = auVar124._12_4_;
  auVar142._12_4_ = fVar334 * auVar19._12_4_;
  auVar19 = vshufps_avx(auVar124,auVar124,0xc9);
  auVar121 = vfmsub231ps_fma(auVar142,auVar19,auVar20);
  auVar20 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar84._0_4_ = fVar243 * auVar20._0_4_;
  auVar84._4_4_ = fVar270 * auVar20._4_4_;
  auVar84._8_4_ = fVar280 * auVar20._8_4_;
  auVar84._12_4_ = fVar334 * auVar20._12_4_;
  auVar255 = vfmsub231ps_fma(auVar84,auVar19,auVar106);
  fVar194 = fVar194 - auVar21._0_4_;
  local_608._0_4_ = auVar62._0_4_;
  local_608._4_4_ = auVar62._4_4_;
  fStack_600 = auVar62._8_4_;
  auVar85._0_4_ = (float)local_608._0_4_ * -0.0;
  auVar85._4_4_ = (float)local_608._4_4_ * -0.0;
  auVar85._8_4_ = fStack_600 * -0.0;
  auVar85._12_4_ = fVar75 * -0.0;
  auVar19 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar95,auVar85);
  auVar161._0_4_ = auVar95._0_4_ + auVar85._0_4_;
  auVar161._4_4_ = auVar95._4_4_ + auVar85._4_4_;
  auVar161._8_4_ = auVar95._8_4_ + auVar85._8_4_;
  auVar161._12_4_ = auVar95._12_4_ + auVar85._12_4_;
  auVar182._0_4_ = auVar16._0_4_ + auVar19._0_4_;
  auVar182._4_4_ = auVar16._4_4_ + auVar19._4_4_;
  auVar182._8_4_ = auVar16._8_4_ + auVar19._8_4_;
  auVar182._12_4_ = auVar16._12_4_ + auVar19._12_4_;
  auVar20 = vpermilps_avx(auVar80,0xc9);
  auVar95 = vdpps_avx(auVar20,auVar20,0x7f);
  auVar16 = vfmadd231ps_fma(auVar161,auVar16,auVar53 << 0x20);
  auVar21 = vfmadd231ps_fma(auVar182,auVar15,auVar227);
  auVar141 = vfmadd231ps_fma(auVar16,auVar15,auVar227);
  fVar178 = auVar95._0_4_;
  auVar106 = ZEXT416((uint)fVar178);
  auVar15 = vrsqrtss_avx(auVar106,auVar106);
  fVar75 = auVar15._0_4_;
  fVar75 = fVar75 * 1.5 + fVar75 * fVar75 * fVar178 * -0.5 * fVar75;
  auVar16 = vpermilps_avx(auVar77,0xc9);
  auVar15 = vdpps_avx(auVar20,auVar16,0x7f);
  auVar228._0_4_ = fVar178 * auVar16._0_4_;
  auVar228._4_4_ = fVar178 * auVar16._4_4_;
  auVar228._8_4_ = fVar178 * auVar16._8_4_;
  auVar228._12_4_ = fVar178 * auVar16._12_4_;
  fVar178 = auVar15._0_4_;
  auVar272._0_4_ = fVar178 * auVar20._0_4_;
  auVar272._4_4_ = fVar178 * auVar20._4_4_;
  auVar272._8_4_ = fVar178 * auVar20._8_4_;
  auVar272._12_4_ = fVar178 * auVar20._12_4_;
  auVar19 = vsubps_avx(auVar228,auVar272);
  auVar15 = vrcpss_avx(auVar106,auVar106);
  auVar16 = vfnmadd213ss_fma(auVar95,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar138 = auVar15._0_4_ * auVar16._0_4_;
  auVar106 = vpermilps_avx(auVar78,0xc9);
  auVar16 = vdpps_avx(auVar106,auVar106,0x7f);
  fVar244 = auVar20._0_4_ * fVar75;
  fVar264 = auVar20._4_4_ * fVar75;
  fVar266 = auVar20._8_4_ * fVar75;
  fVar268 = auVar20._12_4_ * fVar75;
  auVar20 = vpermilps_avx(auVar98,0xc9);
  auVar15 = vblendps_avx(auVar16,_DAT_01feba10,0xe);
  auVar95 = vrsqrtss_avx(auVar15,auVar15);
  fVar195 = auVar16._0_4_;
  fVar178 = auVar95._0_4_;
  auVar95 = vdpps_avx(auVar106,auVar20,0x7f);
  fVar178 = fVar178 * 1.5 + fVar178 * fVar195 * -0.5 * fVar178 * fVar178;
  auVar107._0_4_ = fVar195 * auVar20._0_4_;
  auVar107._4_4_ = fVar195 * auVar20._4_4_;
  auVar107._8_4_ = fVar195 * auVar20._8_4_;
  auVar107._12_4_ = fVar195 * auVar20._12_4_;
  fVar195 = auVar95._0_4_;
  auVar125._0_4_ = fVar195 * auVar106._0_4_;
  auVar125._4_4_ = fVar195 * auVar106._4_4_;
  auVar125._8_4_ = fVar195 * auVar106._8_4_;
  auVar125._12_4_ = fVar195 * auVar106._12_4_;
  auVar95 = vsubps_avx(auVar107,auVar125);
  auVar15 = vrcpss_avx(auVar15,auVar15);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar15,ZEXT416(0x40000000));
  fVar195 = auVar15._0_4_ * auVar16._0_4_;
  fVar136 = auVar106._0_4_ * fVar178;
  fVar156 = auVar106._4_4_ * fVar178;
  fVar157 = auVar106._8_4_ * fVar178;
  fVar158 = auVar106._12_4_ * fVar178;
  auVar15 = vshufps_avx(auVar122,auVar122,0xff);
  auVar16 = vshufps_avx(auVar21,auVar21,0xff);
  auVar200._0_4_ = fVar244 * auVar16._0_4_;
  auVar200._4_4_ = fVar264 * auVar16._4_4_;
  auVar200._8_4_ = fVar266 * auVar16._8_4_;
  auVar200._12_4_ = fVar268 * auVar16._12_4_;
  auVar108._0_4_ = fVar244 * auVar15._0_4_ + fVar75 * fVar138 * auVar19._0_4_ * auVar16._0_4_;
  auVar108._4_4_ = fVar264 * auVar15._4_4_ + fVar75 * fVar138 * auVar19._4_4_ * auVar16._4_4_;
  auVar108._8_4_ = fVar266 * auVar15._8_4_ + fVar75 * fVar138 * auVar19._8_4_ * auVar16._8_4_;
  auVar108._12_4_ = fVar268 * auVar15._12_4_ + fVar75 * fVar138 * auVar19._12_4_ * auVar16._12_4_;
  auVar19 = vsubps_avx(auVar21,auVar200);
  fVar244 = auVar21._0_4_ + auVar200._0_4_;
  fVar264 = auVar21._4_4_ + auVar200._4_4_;
  fVar266 = auVar21._8_4_ + auVar200._8_4_;
  fVar268 = auVar21._12_4_ + auVar200._12_4_;
  auVar20 = vsubps_avx(auVar122,auVar108);
  auVar15 = vshufps_avx(auVar79,auVar79,0xff);
  auVar16 = vshufps_avx(auVar141,auVar141,0xff);
  auVar143._0_4_ = auVar16._0_4_ * fVar136;
  auVar143._4_4_ = auVar16._4_4_ * fVar156;
  auVar143._8_4_ = auVar16._8_4_ * fVar157;
  auVar143._12_4_ = auVar16._12_4_ * fVar158;
  auVar183._0_4_ = auVar15._0_4_ * fVar136 + auVar16._0_4_ * fVar178 * auVar95._0_4_ * fVar195;
  auVar183._4_4_ = auVar15._4_4_ * fVar156 + auVar16._4_4_ * fVar178 * auVar95._4_4_ * fVar195;
  auVar183._8_4_ = auVar15._8_4_ * fVar157 + auVar16._8_4_ * fVar178 * auVar95._8_4_ * fVar195;
  auVar183._12_4_ = auVar15._12_4_ * fVar158 + auVar16._12_4_ * fVar178 * auVar95._12_4_ * fVar195;
  auVar95 = vsubps_avx(auVar141,auVar143);
  local_608._4_4_ = auVar141._4_4_ + auVar143._4_4_;
  local_608._0_4_ = auVar141._0_4_ + auVar143._0_4_;
  fStack_600 = auVar141._8_4_ + auVar143._8_4_;
  fStack_5fc = auVar141._12_4_ + auVar143._12_4_;
  auVar106 = vsubps_avx(auVar79,auVar183);
  auVar86._8_4_ = 0x80000000;
  auVar86._0_8_ = 0x8000000080000000;
  auVar86._12_4_ = 0x80000000;
  local_498 = auVar63._0_4_;
  fStack_494 = auVar63._4_4_;
  fStack_490 = auVar63._8_4_;
  auVar144._0_4_ = local_498 * -0.0;
  auVar144._4_4_ = fStack_494 * -0.0;
  auVar144._8_4_ = fStack_490 * -0.0;
  auVar144._12_4_ = fVar137 * -0.0;
  auVar15 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar18,auVar144);
  auVar229._0_4_ = auVar18._0_4_ + auVar144._0_4_;
  auVar229._4_4_ = auVar18._4_4_ + auVar144._4_4_;
  auVar229._8_4_ = auVar18._8_4_ + auVar144._8_4_;
  auVar229._12_4_ = auVar18._12_4_ + auVar144._12_4_;
  auVar337._0_4_ = auVar17._0_4_ + auVar15._0_4_;
  auVar337._4_4_ = auVar17._4_4_ + auVar15._4_4_;
  auVar337._8_4_ = auVar17._8_4_ + auVar15._8_4_;
  auVar337._12_4_ = auVar17._12_4_ + auVar15._12_4_;
  auVar16 = vfmadd231ps_fma(auVar229,auVar17,ZEXT816(0) << 0x20);
  auVar21 = vfmadd231ps_fma(auVar337,auVar184,auVar86);
  auVar18 = vpermilps_avx(auVar99,0xc9);
  auVar15 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar141 = vfmadd231ps_fma(auVar16,auVar184,auVar86);
  fVar178 = auVar15._0_4_;
  auVar184 = ZEXT416((uint)fVar178);
  auVar16 = vrsqrtss_avx(auVar184,auVar184);
  fVar75 = auVar16._0_4_;
  fVar75 = fVar178 * -0.5 * fVar75 * fVar75 * fVar75 + fVar75 * 1.5;
  auVar16 = vpermilps_avx(auVar100,0xc9);
  auVar273._0_4_ = fVar178 * auVar16._0_4_;
  auVar273._4_4_ = fVar178 * auVar16._4_4_;
  auVar273._8_4_ = fVar178 * auVar16._8_4_;
  auVar273._12_4_ = fVar178 * auVar16._12_4_;
  auVar16 = vdpps_avx(auVar18,auVar16,0x7f);
  fVar178 = auVar16._0_4_;
  auVar249._0_4_ = fVar178 * auVar18._0_4_;
  auVar249._4_4_ = fVar178 * auVar18._4_4_;
  auVar249._8_4_ = fVar178 * auVar18._8_4_;
  auVar249._12_4_ = fVar178 * auVar18._12_4_;
  auVar17 = vsubps_avx(auVar273,auVar249);
  auVar16 = vrcpss_avx(auVar184,auVar184);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar138 = auVar16._0_4_ * auVar15._0_4_;
  fVar137 = auVar18._0_4_ * fVar75;
  fVar136 = auVar18._4_4_ * fVar75;
  fVar156 = auVar18._8_4_ * fVar75;
  fVar157 = auVar18._12_4_ * fVar75;
  auVar184 = vpermilps_avx(auVar121,0xc9);
  auVar15 = vdpps_avx(auVar184,auVar184,0x7f);
  fVar195 = auVar15._0_4_;
  auVar79 = ZEXT416((uint)fVar195);
  auVar16 = vrsqrtss_avx(auVar79,auVar79);
  fVar178 = auVar16._0_4_;
  auVar18 = vpermilps_avx(auVar255,0xc9);
  auVar16 = vdpps_avx(auVar184,auVar18,0x7f);
  fVar178 = fVar178 * 1.5 + fVar195 * -0.5 * fVar178 * fVar178 * fVar178;
  auVar308._0_4_ = fVar195 * auVar18._0_4_;
  auVar308._4_4_ = fVar195 * auVar18._4_4_;
  auVar308._8_4_ = fVar195 * auVar18._8_4_;
  auVar308._12_4_ = fVar195 * auVar18._12_4_;
  fVar195 = auVar16._0_4_;
  auVar87._0_4_ = fVar195 * auVar184._0_4_;
  auVar87._4_4_ = fVar195 * auVar184._4_4_;
  auVar87._8_4_ = fVar195 * auVar184._8_4_;
  auVar87._12_4_ = fVar195 * auVar184._12_4_;
  auVar18 = vsubps_avx(auVar308,auVar87);
  auVar16 = vrcpss_avx(auVar79,auVar79);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar16,SUB6416(ZEXT464(0x40000000),0));
  fVar195 = auVar16._0_4_ * auVar15._0_4_;
  fVar158 = auVar184._0_4_ * fVar178;
  fVar265 = auVar184._4_4_ * fVar178;
  fVar267 = auVar184._8_4_ * fVar178;
  fVar269 = auVar184._12_4_ * fVar178;
  auVar15 = vshufps_avx(auVar123,auVar123,0xff);
  auVar16 = vshufps_avx(auVar21,auVar21,0xff);
  auVar145._0_4_ = auVar16._0_4_ * fVar137;
  auVar145._4_4_ = auVar16._4_4_ * fVar136;
  auVar145._8_4_ = auVar16._8_4_ * fVar156;
  auVar145._12_4_ = auVar16._12_4_ * fVar157;
  auVar162._0_4_ = auVar15._0_4_ * fVar137 + auVar16._0_4_ * fVar75 * auVar17._0_4_ * fVar138;
  auVar162._4_4_ = auVar15._4_4_ * fVar136 + auVar16._4_4_ * fVar75 * auVar17._4_4_ * fVar138;
  auVar162._8_4_ = auVar15._8_4_ * fVar156 + auVar16._8_4_ * fVar75 * auVar17._8_4_ * fVar138;
  auVar162._12_4_ = auVar15._12_4_ * fVar157 + auVar16._12_4_ * fVar75 * auVar17._12_4_ * fVar138;
  auVar17 = vsubps_avx(auVar21,auVar145);
  fVar138 = auVar21._0_4_ + auVar145._0_4_;
  fVar137 = auVar21._4_4_ + auVar145._4_4_;
  fVar136 = auVar21._8_4_ + auVar145._8_4_;
  fVar156 = auVar21._12_4_ + auVar145._12_4_;
  auVar184 = vsubps_avx(auVar123,auVar162);
  auVar15 = vshufps_avx(auVar124,auVar124,0xff);
  auVar16 = vshufps_avx(auVar141,auVar141,0xff);
  auVar250._0_4_ = fVar158 * auVar16._0_4_;
  auVar250._4_4_ = fVar265 * auVar16._4_4_;
  auVar250._8_4_ = fVar267 * auVar16._8_4_;
  auVar250._12_4_ = fVar269 * auVar16._12_4_;
  auVar88._0_4_ = fVar158 * auVar15._0_4_ + auVar16._0_4_ * fVar178 * auVar18._0_4_ * fVar195;
  auVar88._4_4_ = fVar265 * auVar15._4_4_ + auVar16._4_4_ * fVar178 * auVar18._4_4_ * fVar195;
  auVar88._8_4_ = fVar267 * auVar15._8_4_ + auVar16._8_4_ * fVar178 * auVar18._8_4_ * fVar195;
  auVar88._12_4_ = fVar269 * auVar15._12_4_ + auVar16._12_4_ * fVar178 * auVar18._12_4_ * fVar195;
  auVar15 = vsubps_avx(auVar141,auVar250);
  auVar163._0_4_ = auVar250._0_4_ + auVar141._0_4_;
  auVar163._4_4_ = auVar250._4_4_ + auVar141._4_4_;
  auVar163._8_4_ = auVar250._8_4_ + auVar141._8_4_;
  auVar163._12_4_ = auVar250._12_4_ + auVar141._12_4_;
  auVar16 = vsubps_avx(auVar124,auVar88);
  local_638._0_4_ = auVar20._0_4_;
  local_638._4_4_ = auVar20._4_4_;
  fStack_630 = auVar20._8_4_;
  fStack_62c = auVar20._12_4_;
  auVar89._0_4_ = auVar19._0_4_ + (float)local_638._0_4_ * 0.33333334;
  auVar89._4_4_ = auVar19._4_4_ + (float)local_638._4_4_ * 0.33333334;
  auVar89._8_4_ = auVar19._8_4_ + fStack_630 * 0.33333334;
  auVar89._12_4_ = auVar19._12_4_ + fStack_62c * 0.33333334;
  fVar75 = 1.0 - fVar194;
  auVar230._4_4_ = fVar75;
  auVar230._0_4_ = fVar75;
  auVar230._8_4_ = fVar75;
  auVar230._12_4_ = fVar75;
  auVar309._0_4_ = fVar194 * auVar17._0_4_;
  auVar309._4_4_ = fVar194 * auVar17._4_4_;
  auVar309._8_4_ = fVar194 * auVar17._8_4_;
  auVar309._12_4_ = fVar194 * auVar17._12_4_;
  local_3e8 = vfmadd231ps_fma(auVar309,auVar230,auVar19);
  auVar126._0_4_ = fVar194 * (auVar17._0_4_ + auVar184._0_4_ * 0.33333334);
  auVar126._4_4_ = fVar194 * (auVar17._4_4_ + auVar184._4_4_ * 0.33333334);
  auVar126._8_4_ = fVar194 * (auVar17._8_4_ + auVar184._8_4_ * 0.33333334);
  auVar126._12_4_ = fVar194 * (auVar17._12_4_ + auVar184._12_4_ * 0.33333334);
  auVar19 = vfmadd231ps_fma(auVar126,auVar230,auVar89);
  local_618 = auVar106._0_4_;
  fStack_614 = auVar106._4_4_;
  fStack_610 = auVar106._8_4_;
  fStack_60c = auVar106._12_4_;
  auVar90._0_4_ = local_618 * 0.33333334;
  auVar90._4_4_ = fStack_614 * 0.33333334;
  auVar90._8_4_ = fStack_610 * 0.33333334;
  auVar90._12_4_ = fStack_60c * 0.33333334;
  auVar17 = vsubps_avx(auVar95,auVar90);
  auVar54._4_4_ = fVar264;
  auVar54._0_4_ = fVar244;
  auVar54._8_4_ = fVar266;
  auVar54._12_4_ = fVar268;
  auVar321._0_4_ = fVar244 + (fVar221 + auVar108._0_4_) * 0.33333334;
  auVar321._4_4_ = fVar264 + (fVar298 + auVar108._4_4_) * 0.33333334;
  auVar321._8_4_ = fVar266 + (fVar222 + auVar108._8_4_) * 0.33333334;
  auVar321._12_4_ = fVar268 + (fVar223 + auVar108._12_4_) * 0.33333334;
  auVar300._0_4_ = (fVar219 + auVar183._0_4_) * 0.33333334;
  auVar300._4_4_ = (fVar296 + auVar183._4_4_) * 0.33333334;
  auVar300._8_4_ = (fVar220 + auVar183._8_4_) * 0.33333334;
  auVar300._12_4_ = (fVar297 + auVar183._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(_local_608,auVar300);
  auVar283._0_4_ = auVar16._0_4_ * 0.33333334;
  auVar283._4_4_ = auVar16._4_4_ * 0.33333334;
  auVar283._8_4_ = auVar16._8_4_ * 0.33333334;
  auVar283._12_4_ = auVar16._12_4_ * 0.33333334;
  auVar16 = vsubps_avx(auVar15,auVar283);
  auVar251._0_4_ = (fVar243 + auVar88._0_4_) * 0.33333334;
  auVar251._4_4_ = (fVar270 + auVar88._4_4_) * 0.33333334;
  auVar251._8_4_ = (fVar280 + auVar88._8_4_) * 0.33333334;
  auVar251._12_4_ = (fVar334 + auVar88._12_4_) * 0.33333334;
  auVar184 = vsubps_avx(auVar163,auVar251);
  auVar284._0_4_ = fVar194 * auVar16._0_4_;
  auVar284._4_4_ = fVar194 * auVar16._4_4_;
  auVar284._8_4_ = fVar194 * auVar16._8_4_;
  auVar284._12_4_ = fVar194 * auVar16._12_4_;
  auVar201._0_4_ = fVar194 * auVar15._0_4_;
  auVar201._4_4_ = fVar194 * auVar15._4_4_;
  auVar201._8_4_ = fVar194 * auVar15._8_4_;
  auVar201._12_4_ = fVar194 * auVar15._12_4_;
  local_3f8 = vfmadd231ps_fma(auVar284,auVar230,auVar17);
  auVar20 = vfmadd231ps_fma(auVar201,auVar230,auVar95);
  auVar91._0_4_ = fVar194 * fVar138;
  auVar91._4_4_ = fVar194 * fVar137;
  auVar91._8_4_ = fVar194 * fVar136;
  auVar91._12_4_ = fVar194 * fVar156;
  auVar109._0_4_ = fVar194 * (fVar138 + (fVar217 + auVar162._0_4_) * 0.33333334);
  auVar109._4_4_ = fVar194 * (fVar137 + (fVar294 + auVar162._4_4_) * 0.33333334);
  auVar109._8_4_ = fVar194 * (fVar136 + (fVar218 + auVar162._8_4_) * 0.33333334);
  auVar109._12_4_ = fVar194 * (fVar156 + (fVar295 + auVar162._12_4_) * 0.33333334);
  auVar146._0_4_ = fVar194 * auVar184._0_4_;
  auVar146._4_4_ = fVar194 * auVar184._4_4_;
  auVar146._8_4_ = fVar194 * auVar184._8_4_;
  auVar146._12_4_ = fVar194 * auVar184._12_4_;
  auVar164._0_4_ = fVar194 * auVar163._0_4_;
  auVar164._4_4_ = fVar194 * auVar163._4_4_;
  auVar164._8_4_ = fVar194 * auVar163._8_4_;
  auVar164._12_4_ = fVar194 * auVar163._12_4_;
  _local_408 = vfmadd231ps_fma(auVar91,auVar230,auVar54);
  auVar106 = vfmadd231ps_fma(auVar109,auVar230,auVar321);
  auVar21 = vfmadd231ps_fma(auVar146,auVar230,auVar18);
  auVar124 = vfmadd231ps_fma(auVar164,auVar230,_local_608);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3c8 = vsubps_avx(local_3e8,auVar15);
  auVar16 = vshufps_avx(local_3c8,local_3c8,0x55);
  auVar95 = vshufps_avx(local_3c8,local_3c8,0xaa);
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar75 = pre->ray_space[k].vz.field_0.m128[0];
  fVar178 = pre->ray_space[k].vz.field_0.m128[1];
  fVar194 = pre->ray_space[k].vz.field_0.m128[2];
  fVar138 = pre->ray_space[k].vz.field_0.m128[3];
  auVar92._0_4_ = fVar75 * auVar95._0_4_;
  auVar92._4_4_ = fVar178 * auVar95._4_4_;
  auVar92._8_4_ = fVar194 * auVar95._8_4_;
  auVar92._12_4_ = fVar138 * auVar95._12_4_;
  auVar17 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar5,auVar16);
  local_3d8 = vsubps_avx(auVar19,auVar15);
  auVar16 = vshufps_avx(local_3d8,local_3d8,0x55);
  auVar95 = vshufps_avx(local_3d8,local_3d8,0xaa);
  auVar346._0_4_ = fVar75 * auVar95._0_4_;
  auVar346._4_4_ = fVar178 * auVar95._4_4_;
  auVar346._8_4_ = fVar194 * auVar95._8_4_;
  auVar346._12_4_ = fVar138 * auVar95._12_4_;
  auVar95 = vfmadd231ps_fma(auVar346,(undefined1  [16])aVar5,auVar16);
  local_2c8 = vsubps_avx(local_3f8,auVar15);
  auVar16 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar338._0_4_ = fVar75 * auVar16._0_4_;
  auVar338._4_4_ = fVar178 * auVar16._4_4_;
  auVar338._8_4_ = fVar194 * auVar16._8_4_;
  auVar338._12_4_ = fVar138 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_2c8,local_2c8,0x55);
  auVar18 = vfmadd231ps_fma(auVar338,(undefined1  [16])aVar5,auVar16);
  local_2d8 = vsubps_avx(auVar20,auVar15);
  auVar16 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar322._0_4_ = fVar75 * auVar16._0_4_;
  auVar322._4_4_ = fVar178 * auVar16._4_4_;
  auVar322._8_4_ = fVar194 * auVar16._8_4_;
  auVar322._12_4_ = fVar138 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_2d8,local_2d8,0x55);
  auVar184 = vfmadd231ps_fma(auVar322,(undefined1  [16])aVar5,auVar16);
  local_2e8 = vsubps_avx(_local_408,auVar15);
  auVar16 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar165._0_4_ = fVar75 * auVar16._0_4_;
  auVar165._4_4_ = fVar178 * auVar16._4_4_;
  auVar165._8_4_ = fVar194 * auVar16._8_4_;
  auVar165._12_4_ = fVar138 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_2e8,local_2e8,0x55);
  auVar141 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar5,auVar16);
  local_2f8 = vsubps_avx(auVar106,auVar15);
  auVar16 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar231._0_4_ = fVar75 * auVar16._0_4_;
  auVar231._4_4_ = fVar178 * auVar16._4_4_;
  auVar231._8_4_ = fVar194 * auVar16._8_4_;
  auVar231._12_4_ = fVar138 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar79 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar5,auVar16);
  local_308 = vsubps_avx(auVar21,auVar15);
  auVar16 = vshufps_avx(local_308,local_308,0xaa);
  auVar274._0_4_ = fVar75 * auVar16._0_4_;
  auVar274._4_4_ = fVar178 * auVar16._4_4_;
  auVar274._8_4_ = fVar194 * auVar16._8_4_;
  auVar274._12_4_ = fVar138 * auVar16._12_4_;
  auVar16 = vshufps_avx(local_308,local_308,0x55);
  auVar16 = vfmadd231ps_fma(auVar274,(undefined1  [16])aVar5,auVar16);
  local_318 = vsubps_avx(auVar124,auVar15);
  auVar15 = vshufps_avx(local_318,local_318,0xaa);
  auVar185._0_4_ = fVar75 * auVar15._0_4_;
  auVar185._4_4_ = fVar178 * auVar15._4_4_;
  auVar185._8_4_ = fVar194 * auVar15._8_4_;
  auVar185._12_4_ = fVar138 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_318,local_318,0x55);
  auVar15 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar15);
  auVar202._4_4_ = local_3c8._0_4_;
  auVar202._0_4_ = local_3c8._0_4_;
  auVar202._8_4_ = local_3c8._0_4_;
  auVar202._12_4_ = local_3c8._0_4_;
  aVar5 = pre->ray_space[k].vx.field_0;
  auVar80 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar202);
  auVar203._4_4_ = local_3d8._0_4_;
  auVar203._0_4_ = local_3d8._0_4_;
  auVar203._8_4_ = local_3d8._0_4_;
  auVar203._12_4_ = local_3d8._0_4_;
  auVar77 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar5,auVar203);
  uVar76 = local_2c8._0_4_;
  auVar204._4_4_ = uVar76;
  auVar204._0_4_ = uVar76;
  auVar204._8_4_ = uVar76;
  auVar204._12_4_ = uVar76;
  auVar78 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar204);
  uVar76 = local_2d8._0_4_;
  auVar205._4_4_ = uVar76;
  auVar205._0_4_ = uVar76;
  auVar205._8_4_ = uVar76;
  auVar205._12_4_ = uVar76;
  auVar98 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar5,auVar205);
  uVar76 = local_2e8._0_4_;
  auVar206._4_4_ = uVar76;
  auVar206._0_4_ = uVar76;
  auVar206._8_4_ = uVar76;
  auVar206._12_4_ = uVar76;
  auVar141 = vfmadd231ps_fma(auVar141,(undefined1  [16])aVar5,auVar206);
  uVar76 = local_2f8._0_4_;
  auVar207._4_4_ = uVar76;
  auVar207._0_4_ = uVar76;
  auVar207._8_4_ = uVar76;
  auVar207._12_4_ = uVar76;
  auVar79 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar5,auVar207);
  uVar76 = local_308._0_4_;
  auVar208._4_4_ = uVar76;
  auVar208._0_4_ = uVar76;
  auVar208._8_4_ = uVar76;
  auVar208._12_4_ = uVar76;
  auVar99 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar208);
  uVar76 = local_318._0_4_;
  auVar209._4_4_ = uVar76;
  auVar209._0_4_ = uVar76;
  auVar209._8_4_ = uVar76;
  auVar209._12_4_ = uVar76;
  auVar100 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar209);
  auVar17 = vmovlhps_avx(auVar80,auVar141);
  auVar18 = vmovlhps_avx(auVar77,auVar79);
  auVar184 = vmovlhps_avx(auVar78,auVar99);
  _local_3b8 = vmovlhps_avx(auVar98,auVar100);
  auVar15 = vminps_avx(auVar17,auVar18);
  auVar16 = vminps_avx(auVar184,_local_3b8);
  auVar95 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(auVar17,auVar18);
  auVar16 = vmaxps_avx(auVar184,_local_3b8);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vshufpd_avx(auVar95,auVar95,3);
  auVar95 = vminps_avx(auVar95,auVar16);
  auVar16 = vshufpd_avx(auVar15,auVar15,3);
  auVar16 = vmaxps_avx(auVar15,auVar16);
  auVar15 = vandps_avx(auVar95,auVar344);
  auVar16 = vandps_avx(auVar16,auVar344);
  auVar15 = vmaxps_avx(auVar15,auVar16);
  auVar16 = vmovshdup_avx(auVar15);
  auVar15 = vmaxss_avx(auVar16,auVar15);
  local_198 = auVar15._0_4_ * 9.536743e-07;
  auVar210._8_8_ = auVar80._0_8_;
  auVar210._0_8_ = auVar80._0_8_;
  auVar252._8_8_ = auVar77._0_8_;
  auVar252._0_8_ = auVar77._0_8_;
  auVar285._8_8_ = auVar78._0_8_;
  auVar285._0_8_ = auVar78._0_8_;
  auVar323._0_8_ = auVar98._0_8_;
  auVar323._8_8_ = auVar323._0_8_;
  local_2b8 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  fStack_1b0 = -local_198;
  local_1b8 = -local_198;
  fStack_1b4 = -local_198;
  fStack_1ac = fStack_1b0;
  fStack_1a8 = fStack_1b0;
  fStack_1a4 = fStack_1b0;
  fStack_1a0 = fStack_1b0;
  fStack_19c = fStack_1b0;
  local_388 = uVar67;
  uStack_384 = uVar67;
  uStack_380 = uVar67;
  uStack_37c = uVar67;
  local_398 = uVar7;
  uStack_394 = uVar7;
  uStack_390 = uVar7;
  uStack_38c = uVar7;
  uVar68 = 0;
  fVar75 = *(float *)(ray + k * 4 + 0x30);
  auVar15 = vsubps_avx(auVar18,auVar17);
  local_298 = vsubps_avx(auVar184,auVar18);
  local_2a8 = vsubps_avx(_local_3b8,auVar184);
  local_338 = vsubps_avx(_local_408,local_3e8);
  local_348 = vsubps_avx(auVar106,auVar19);
  local_358 = vsubps_avx(auVar21,local_3f8);
  _local_368 = vsubps_avx(auVar124,auVar20);
  local_658 = ZEXT816(0x3f80000000000000);
  local_328 = local_658;
  do {
    auVar16 = vshufps_avx(local_658,local_658,0x50);
    auVar147._8_4_ = 0x3f800000;
    auVar147._0_8_ = &DAT_3f8000003f800000;
    auVar147._12_4_ = 0x3f800000;
    auVar153._16_4_ = 0x3f800000;
    auVar153._0_16_ = auVar147;
    auVar153._20_4_ = 0x3f800000;
    auVar153._24_4_ = 0x3f800000;
    auVar153._28_4_ = 0x3f800000;
    auVar95 = vsubps_avx(auVar147,auVar16);
    fVar178 = auVar16._0_4_;
    fVar158 = auVar141._0_4_;
    auVar93._0_4_ = fVar158 * fVar178;
    fVar194 = auVar16._4_4_;
    fVar244 = auVar141._4_4_;
    auVar93._4_4_ = fVar244 * fVar194;
    fVar138 = auVar16._8_4_;
    auVar93._8_4_ = fVar158 * fVar138;
    fVar195 = auVar16._12_4_;
    auVar93._12_4_ = fVar244 * fVar195;
    fVar223 = auVar79._0_4_;
    auVar186._0_4_ = fVar223 * fVar178;
    fVar243 = auVar79._4_4_;
    auVar186._4_4_ = fVar243 * fVar194;
    auVar186._8_4_ = fVar223 * fVar138;
    auVar186._12_4_ = fVar243 * fVar195;
    fVar270 = auVar99._0_4_;
    auVar232._0_4_ = fVar270 * fVar178;
    fVar280 = auVar99._4_4_;
    auVar232._4_4_ = fVar280 * fVar194;
    auVar232._8_4_ = fVar270 * fVar138;
    auVar232._12_4_ = fVar280 * fVar195;
    fVar334 = auVar100._0_4_;
    auVar310._0_4_ = fVar334 * fVar178;
    fVar343 = auVar100._4_4_;
    auVar310._4_4_ = fVar343 * fVar194;
    auVar310._8_4_ = fVar334 * fVar138;
    auVar310._12_4_ = fVar343 * fVar195;
    auVar78 = vfmadd231ps_fma(auVar93,auVar95,auVar210);
    auVar98 = vfmadd231ps_fma(auVar186,auVar95,auVar252);
    auVar121 = vfmadd231ps_fma(auVar232,auVar95,auVar285);
    auVar255 = vfmadd231ps_fma(auVar310,auVar323,auVar95);
    local_5b8 = auVar255._0_4_;
    auVar16 = vmovshdup_avx(local_328);
    fVar178 = local_328._0_4_;
    fVar137 = (auVar16._0_4_ - fVar178) * 0.04761905;
    auVar263._4_4_ = fVar178;
    auVar263._0_4_ = fVar178;
    auVar263._8_4_ = fVar178;
    auVar263._12_4_ = fVar178;
    auVar263._16_4_ = fVar178;
    auVar263._20_4_ = fVar178;
    auVar263._24_4_ = fVar178;
    auVar263._28_4_ = fVar178;
    auVar133._0_8_ = auVar16._0_8_;
    auVar133._8_8_ = auVar133._0_8_;
    auVar133._16_8_ = auVar133._0_8_;
    auVar133._24_8_ = auVar133._0_8_;
    auVar97 = vsubps_avx(auVar133,auVar263);
    uVar76 = auVar78._0_4_;
    auVar350._4_4_ = uVar76;
    auVar350._0_4_ = uVar76;
    auVar350._8_4_ = uVar76;
    auVar350._12_4_ = uVar76;
    auVar350._16_4_ = uVar76;
    auVar350._20_4_ = uVar76;
    auVar350._24_4_ = uVar76;
    auVar350._28_4_ = uVar76;
    auVar16 = vmovshdup_avx(auVar78);
    uVar196 = auVar16._0_8_;
    auVar332._8_8_ = uVar196;
    auVar332._0_8_ = uVar196;
    auVar332._16_8_ = uVar196;
    auVar332._24_8_ = uVar196;
    fVar136 = auVar98._0_4_;
    auVar118._4_4_ = fVar136;
    auVar118._0_4_ = fVar136;
    auVar118._8_4_ = fVar136;
    auVar118._12_4_ = fVar136;
    auVar118._16_4_ = fVar136;
    auVar118._20_4_ = fVar136;
    auVar118._24_4_ = fVar136;
    auVar118._28_4_ = fVar136;
    auVar95 = vmovshdup_avx(auVar98);
    auVar214._0_8_ = auVar95._0_8_;
    auVar214._8_8_ = auVar214._0_8_;
    auVar214._16_8_ = auVar214._0_8_;
    auVar214._24_8_ = auVar214._0_8_;
    fVar264 = auVar121._0_4_;
    auVar306._4_4_ = fVar264;
    auVar306._0_4_ = fVar264;
    auVar306._8_4_ = fVar264;
    auVar306._12_4_ = fVar264;
    auVar306._16_4_ = fVar264;
    auVar306._20_4_ = fVar264;
    auVar306._24_4_ = fVar264;
    auVar306._28_4_ = fVar264;
    auVar80 = vmovshdup_avx(auVar121);
    auVar279._0_8_ = auVar80._0_8_;
    auVar279._8_8_ = auVar279._0_8_;
    auVar279._16_8_ = auVar279._0_8_;
    auVar279._24_8_ = auVar279._0_8_;
    auVar77 = vmovshdup_avx(auVar255);
    auVar122 = vfmadd132ps_fma(auVar97,auVar263,_DAT_02020f20);
    auVar97 = vsubps_avx(auVar153,ZEXT1632(auVar122));
    fVar178 = auVar122._0_4_;
    auVar340._0_4_ = fVar136 * fVar178;
    fVar194 = auVar122._4_4_;
    auVar340._4_4_ = fVar136 * fVar194;
    fVar138 = auVar122._8_4_;
    auVar340._8_4_ = fVar136 * fVar138;
    fVar195 = auVar122._12_4_;
    auVar340._12_4_ = fVar136 * fVar195;
    auVar340._16_4_ = fVar136 * 0.0;
    auVar340._20_4_ = fVar136 * 0.0;
    auVar340._24_4_ = fVar136 * 0.0;
    auVar340._28_4_ = 0;
    auVar122 = vfmadd231ps_fma(auVar340,auVar97,auVar350);
    fVar156 = auVar95._0_4_;
    auVar317._0_4_ = fVar156 * fVar178;
    fVar157 = auVar95._4_4_;
    auVar317._4_4_ = fVar157 * fVar194;
    auVar317._8_4_ = fVar156 * fVar138;
    auVar317._12_4_ = fVar157 * fVar195;
    auVar317._16_4_ = fVar156 * 0.0;
    auVar317._20_4_ = fVar157 * 0.0;
    auVar317._24_4_ = fVar156 * 0.0;
    auVar317._28_4_ = 0;
    auVar123 = vfmadd231ps_fma(auVar317,auVar97,auVar332);
    auVar22._4_4_ = fVar264 * fVar194;
    auVar22._0_4_ = fVar264 * fVar178;
    auVar22._8_4_ = fVar264 * fVar138;
    auVar22._12_4_ = fVar264 * fVar195;
    auVar22._16_4_ = fVar264 * 0.0;
    auVar22._20_4_ = fVar264 * 0.0;
    auVar22._24_4_ = fVar264 * 0.0;
    auVar22._28_4_ = auVar16._4_4_;
    auVar159 = vfmadd231ps_fma(auVar22,auVar97,auVar118);
    fVar156 = auVar80._0_4_;
    fVar157 = auVar80._4_4_;
    auVar23._4_4_ = fVar157 * fVar194;
    auVar23._0_4_ = fVar156 * fVar178;
    auVar23._8_4_ = fVar156 * fVar138;
    auVar23._12_4_ = fVar157 * fVar195;
    auVar23._16_4_ = fVar156 * 0.0;
    auVar23._20_4_ = fVar157 * 0.0;
    auVar23._24_4_ = fVar156 * 0.0;
    auVar23._28_4_ = uVar76;
    auVar168 = vfmadd231ps_fma(auVar23,auVar97,auVar214);
    auVar16 = vshufps_avx(auVar78,auVar78,0xaa);
    auVar215._0_8_ = auVar16._0_8_;
    auVar215._8_8_ = auVar215._0_8_;
    auVar215._16_8_ = auVar215._0_8_;
    auVar215._24_8_ = auVar215._0_8_;
    auVar95 = vshufps_avx(auVar78,auVar78,0xff);
    uStack_5d0 = auVar95._0_8_;
    local_5d8 = (undefined1  [8])uStack_5d0;
    uStack_5c8 = uStack_5d0;
    uStack_5c0 = uStack_5d0;
    auVar24._4_4_ = fVar194 * local_5b8;
    auVar24._0_4_ = fVar178 * local_5b8;
    auVar24._8_4_ = fVar138 * local_5b8;
    auVar24._12_4_ = fVar195 * local_5b8;
    auVar24._16_4_ = local_5b8 * 0.0;
    auVar24._20_4_ = local_5b8 * 0.0;
    auVar24._24_4_ = local_5b8 * 0.0;
    auVar24._28_4_ = 0x3f800000;
    auVar189 = vfmadd231ps_fma(auVar24,auVar97,auVar306);
    auVar80 = vshufps_avx(auVar98,auVar98,0xaa);
    auVar176._0_8_ = auVar80._0_8_;
    auVar176._8_8_ = auVar176._0_8_;
    auVar176._16_8_ = auVar176._0_8_;
    auVar176._24_8_ = auVar176._0_8_;
    auVar78 = vshufps_avx(auVar98,auVar98,0xff);
    auVar193._0_8_ = auVar78._0_8_;
    auVar193._8_8_ = auVar193._0_8_;
    auVar193._16_8_ = auVar193._0_8_;
    auVar193._24_8_ = auVar193._0_8_;
    fVar156 = auVar77._0_4_;
    fVar157 = auVar77._4_4_;
    auVar25._4_4_ = fVar157 * fVar194;
    auVar25._0_4_ = fVar156 * fVar178;
    auVar25._8_4_ = fVar156 * fVar138;
    auVar25._12_4_ = fVar157 * fVar195;
    auVar25._16_4_ = fVar156 * 0.0;
    auVar25._20_4_ = fVar157 * 0.0;
    auVar25._24_4_ = fVar156 * 0.0;
    auVar25._28_4_ = fVar264;
    auVar197 = vfmadd231ps_fma(auVar25,auVar97,auVar279);
    auVar26._28_4_ = fVar136;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar159._12_4_ * fVar195,
                            CONCAT48(auVar159._8_4_ * fVar138,
                                     CONCAT44(auVar159._4_4_ * fVar194,auVar159._0_4_ * fVar178))));
    auVar122 = vfmadd231ps_fma(auVar26,auVar97,ZEXT1632(auVar122));
    auVar27._28_4_ = auVar95._4_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar168._12_4_ * fVar195,
                            CONCAT48(auVar168._8_4_ * fVar138,
                                     CONCAT44(auVar168._4_4_ * fVar194,auVar168._0_4_ * fVar178))));
    auVar123 = vfmadd231ps_fma(auVar27,auVar97,ZEXT1632(auVar123));
    auVar95 = vshufps_avx(auVar121,auVar121,0xaa);
    uVar196 = auVar95._0_8_;
    auVar318._8_8_ = uVar196;
    auVar318._0_8_ = uVar196;
    auVar318._16_8_ = uVar196;
    auVar318._24_8_ = uVar196;
    auVar77 = vshufps_avx(auVar121,auVar121,0xff);
    uVar196 = auVar77._0_8_;
    auVar341._8_8_ = uVar196;
    auVar341._0_8_ = uVar196;
    auVar341._16_8_ = uVar196;
    auVar341._24_8_ = uVar196;
    auVar159 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar189._12_4_,
                                                  CONCAT48(fVar138 * auVar189._8_4_,
                                                           CONCAT44(fVar194 * auVar189._4_4_,
                                                                    fVar178 * auVar189._0_4_)))),
                               auVar97,ZEXT1632(auVar159));
    auVar98 = vshufps_avx(auVar255,auVar255,0xaa);
    auVar121 = vshufps_avx(auVar255,auVar255,0xff);
    local_5b8 = auVar121._0_4_;
    fStack_5b4 = auVar121._4_4_;
    auVar28._28_4_ = fStack_5b4;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar197._12_4_ * fVar195,
                            CONCAT48(auVar197._8_4_ * fVar138,
                                     CONCAT44(auVar197._4_4_ * fVar194,auVar197._0_4_ * fVar178))));
    auVar121 = vfmadd231ps_fma(auVar28,auVar97,ZEXT1632(auVar168));
    auVar255 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar159._12_4_,
                                                  CONCAT48(fVar138 * auVar159._8_4_,
                                                           CONCAT44(fVar194 * auVar159._4_4_,
                                                                    fVar178 * auVar159._0_4_)))),
                               auVar97,ZEXT1632(auVar122));
    auVar22 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar122));
    auVar122 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar121._12_4_,
                                                  CONCAT48(fVar138 * auVar121._8_4_,
                                                           CONCAT44(fVar194 * auVar121._4_4_,
                                                                    fVar178 * auVar121._0_4_)))),
                               auVar97,ZEXT1632(auVar123));
    auVar23 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar123));
    fVar265 = fVar137 * auVar22._0_4_ * 3.0;
    fVar269 = fVar137 * auVar22._4_4_ * 3.0;
    auVar29._4_4_ = fVar269;
    auVar29._0_4_ = fVar265;
    fVar294 = fVar137 * auVar22._8_4_ * 3.0;
    auVar29._8_4_ = fVar294;
    fVar295 = fVar137 * auVar22._12_4_ * 3.0;
    auVar29._12_4_ = fVar295;
    fVar296 = fVar137 * auVar22._16_4_ * 3.0;
    auVar29._16_4_ = fVar296;
    fVar297 = fVar137 * auVar22._20_4_ * 3.0;
    auVar29._20_4_ = fVar297;
    fVar298 = fVar137 * auVar22._24_4_ * 3.0;
    auVar29._24_4_ = fVar298;
    auVar29._28_4_ = 0x40400000;
    local_638._0_4_ = fVar137 * auVar23._0_4_ * 3.0;
    local_638._4_4_ = fVar137 * auVar23._4_4_ * 3.0;
    fStack_630 = fVar137 * auVar23._8_4_ * 3.0;
    fStack_62c = fVar137 * auVar23._12_4_ * 3.0;
    fStack_628 = fVar137 * auVar23._16_4_ * 3.0;
    fStack_624 = fVar137 * auVar23._20_4_ * 3.0;
    fStack_620 = fVar137 * auVar23._24_4_ * 3.0;
    fStack_61c = auVar23._28_4_;
    fVar136 = auVar80._0_4_;
    fVar156 = auVar80._4_4_;
    auVar319._4_4_ = fVar156 * fVar194;
    auVar319._0_4_ = fVar136 * fVar178;
    auVar319._8_4_ = fVar136 * fVar138;
    auVar319._12_4_ = fVar156 * fVar195;
    auVar319._16_4_ = fVar136 * 0.0;
    auVar319._20_4_ = fVar156 * 0.0;
    auVar319._24_4_ = fVar136 * 0.0;
    auVar319._28_4_ = auVar22._28_4_;
    auVar80 = vfmadd231ps_fma(auVar319,auVar97,auVar215);
    fVar136 = auVar78._0_4_;
    fVar157 = auVar78._4_4_;
    auVar31._4_4_ = fVar157 * fVar194;
    auVar31._0_4_ = fVar136 * fVar178;
    auVar31._8_4_ = fVar136 * fVar138;
    auVar31._12_4_ = fVar157 * fVar195;
    auVar31._16_4_ = fVar136 * 0.0;
    auVar31._20_4_ = fVar157 * 0.0;
    auVar31._24_4_ = fVar136 * 0.0;
    auVar31._28_4_ = auVar16._4_4_;
    auVar16 = vfmadd231ps_fma(auVar31,auVar97,_local_5d8);
    fVar136 = auVar95._0_4_;
    fVar157 = auVar95._4_4_;
    auVar32._4_4_ = fVar157 * fVar194;
    auVar32._0_4_ = fVar136 * fVar178;
    auVar32._8_4_ = fVar136 * fVar138;
    auVar32._12_4_ = fVar157 * fVar195;
    auVar32._16_4_ = fVar136 * 0.0;
    auVar32._20_4_ = fVar157 * 0.0;
    auVar32._24_4_ = fVar136 * 0.0;
    auVar32._28_4_ = fVar137;
    auVar95 = vfmadd231ps_fma(auVar32,auVar97,auVar176);
    fVar136 = auVar77._0_4_;
    fVar264 = auVar77._4_4_;
    auVar33._4_4_ = fVar264 * fVar194;
    auVar33._0_4_ = fVar136 * fVar178;
    auVar33._8_4_ = fVar136 * fVar138;
    auVar33._12_4_ = fVar264 * fVar195;
    auVar33._16_4_ = fVar136 * 0.0;
    auVar33._20_4_ = fVar264 * 0.0;
    auVar33._24_4_ = fVar136 * 0.0;
    auVar33._28_4_ = fVar156;
    auVar77 = vfmadd231ps_fma(auVar33,auVar97,auVar193);
    auVar26 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar255));
    fVar136 = auVar98._0_4_;
    fVar156 = auVar98._4_4_;
    auVar34._4_4_ = fVar156 * fVar194;
    auVar34._0_4_ = fVar136 * fVar178;
    auVar34._8_4_ = fVar136 * fVar138;
    auVar34._12_4_ = fVar156 * fVar195;
    auVar34._16_4_ = fVar136 * 0.0;
    auVar34._20_4_ = fVar156 * 0.0;
    auVar34._24_4_ = fVar136 * 0.0;
    auVar34._28_4_ = auVar26._28_4_;
    auVar78 = vfmadd231ps_fma(auVar34,auVar97,auVar318);
    auVar27 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar122));
    auVar35._4_4_ = fVar194 * fStack_5b4;
    auVar35._0_4_ = fVar178 * local_5b8;
    auVar35._8_4_ = fVar138 * local_5b8;
    auVar35._12_4_ = fVar195 * fStack_5b4;
    auVar35._16_4_ = local_5b8 * 0.0;
    auVar35._20_4_ = fStack_5b4 * 0.0;
    auVar35._24_4_ = local_5b8 * 0.0;
    auVar35._28_4_ = fVar157;
    auVar98 = vfmadd231ps_fma(auVar35,auVar97,auVar341);
    auVar36._28_4_ = fVar156;
    auVar36._0_28_ =
         ZEXT1628(CONCAT412(fVar195 * auVar95._12_4_,
                            CONCAT48(fVar138 * auVar95._8_4_,
                                     CONCAT44(fVar194 * auVar95._4_4_,fVar178 * auVar95._0_4_))));
    auVar80 = vfmadd231ps_fma(auVar36,auVar97,ZEXT1632(auVar80));
    auVar16 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar77._12_4_,
                                                 CONCAT48(fVar138 * auVar77._8_4_,
                                                          CONCAT44(fVar194 * auVar77._4_4_,
                                                                   fVar178 * auVar77._0_4_)))),
                              auVar97,ZEXT1632(auVar16));
    fVar265 = auVar255._0_4_ + fVar265;
    fVar269 = auVar255._4_4_ + fVar269;
    fVar294 = auVar255._8_4_ + fVar294;
    fVar295 = auVar255._12_4_ + fVar295;
    fVar296 = fVar296 + 0.0;
    fVar297 = fVar297 + 0.0;
    fVar298 = fVar298 + 0.0;
    auVar37._28_4_ = 0x40400000;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(auVar98._12_4_ * fVar195,
                            CONCAT48(auVar98._8_4_ * fVar138,
                                     CONCAT44(auVar98._4_4_ * fVar194,auVar98._0_4_ * fVar178))));
    auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar78._12_4_,
                                                 CONCAT48(fVar138 * auVar78._8_4_,
                                                          CONCAT44(fVar194 * auVar78._4_4_,
                                                                   fVar178 * auVar78._0_4_)))),
                              auVar97,ZEXT1632(auVar95));
    auVar77 = vfmadd231ps_fma(auVar37,auVar97,ZEXT1632(auVar77));
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar95._12_4_,
                                                 CONCAT48(fVar138 * auVar95._8_4_,
                                                          CONCAT44(fVar194 * auVar95._4_4_,
                                                                   fVar178 * auVar95._0_4_)))),
                              auVar97,ZEXT1632(auVar80));
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar77._12_4_,
                                                 CONCAT48(fVar138 * auVar77._8_4_,
                                                          CONCAT44(fVar194 * auVar77._4_4_,
                                                                   fVar178 * auVar77._0_4_)))),
                              ZEXT1632(auVar16),auVar97);
    auVar97 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar80));
    auVar22 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar16));
    fVar178 = fVar137 * auVar97._0_4_ * 3.0;
    fVar194 = fVar137 * auVar97._4_4_ * 3.0;
    auVar38._4_4_ = fVar194;
    auVar38._0_4_ = fVar178;
    fVar138 = fVar137 * auVar97._8_4_ * 3.0;
    auVar38._8_4_ = fVar138;
    fVar195 = fVar137 * auVar97._12_4_ * 3.0;
    auVar38._12_4_ = fVar195;
    fVar264 = fVar137 * auVar97._16_4_ * 3.0;
    auVar38._16_4_ = fVar264;
    fVar266 = fVar137 * auVar97._20_4_ * 3.0;
    auVar38._20_4_ = fVar266;
    fVar268 = fVar137 * auVar97._24_4_ * 3.0;
    auVar38._24_4_ = fVar268;
    auVar38._28_4_ = 0x40400000;
    auVar242._0_4_ = fVar137 * auVar22._0_4_ * 3.0;
    auVar242._4_4_ = fVar137 * auVar22._4_4_ * 3.0;
    auVar242._8_4_ = fVar137 * auVar22._8_4_ * 3.0;
    auVar242._12_4_ = fVar137 * auVar22._12_4_ * 3.0;
    auVar242._16_4_ = fVar137 * auVar22._16_4_ * 3.0;
    auVar242._20_4_ = fVar137 * auVar22._20_4_ * 3.0;
    auVar242._24_4_ = fVar137 * auVar22._24_4_ * 3.0;
    auVar242._28_4_ = 0;
    auVar28 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar78));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar98));
    auVar97 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar255));
    auVar22 = vsubps_avx(ZEXT1632(auVar98),ZEXT1632(auVar122));
    auVar24 = vsubps_avx(auVar28,auVar26);
    fVar267 = auVar97._0_4_ + auVar24._0_4_;
    fVar217 = auVar97._4_4_ + auVar24._4_4_;
    fVar218 = auVar97._8_4_ + auVar24._8_4_;
    fVar219 = auVar97._12_4_ + auVar24._12_4_;
    fVar220 = auVar97._16_4_ + auVar24._16_4_;
    fVar221 = auVar97._20_4_ + auVar24._20_4_;
    fVar222 = auVar97._24_4_ + auVar24._24_4_;
    auVar25 = vsubps_avx(local_78,auVar27);
    auVar333._0_4_ = auVar22._0_4_ + auVar25._0_4_;
    auVar333._4_4_ = auVar22._4_4_ + auVar25._4_4_;
    auVar333._8_4_ = auVar22._8_4_ + auVar25._8_4_;
    auVar333._12_4_ = auVar22._12_4_ + auVar25._12_4_;
    auVar333._16_4_ = auVar22._16_4_ + auVar25._16_4_;
    auVar333._20_4_ = auVar22._20_4_ + auVar25._20_4_;
    auVar333._24_4_ = auVar22._24_4_ + auVar25._24_4_;
    auVar333._28_4_ = auVar22._28_4_ + auVar25._28_4_;
    fVar137 = auVar122._0_4_;
    local_158 = fVar137 + (float)local_638._0_4_;
    fVar136 = auVar122._4_4_;
    fStack_154 = fVar136 + (float)local_638._4_4_;
    fVar156 = auVar122._8_4_;
    fStack_150 = fVar156 + fStack_630;
    fVar157 = auVar122._12_4_;
    fStack_14c = fVar157 + fStack_62c;
    fStack_148 = fStack_628 + 0.0;
    fStack_144 = fStack_624 + 0.0;
    fStack_140 = fStack_620 + 0.0;
    fStack_13c = auVar23._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar255);
    auVar22 = vsubps_avx(local_98,auVar29);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    local_b8 = ZEXT1632(auVar122);
    auVar22 = vsubps_avx(local_b8,_local_638);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    local_f8._0_4_ = auVar78._0_4_ + fVar178;
    local_f8._4_4_ = auVar78._4_4_ + fVar194;
    local_f8._8_4_ = auVar78._8_4_ + fVar138;
    local_f8._12_4_ = auVar78._12_4_ + fVar195;
    local_f8._16_4_ = fVar264 + 0.0;
    local_f8._20_4_ = fVar266 + 0.0;
    local_f8._24_4_ = fVar268 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar319 = ZEXT1632(auVar78);
    auVar22 = vsubps_avx(auVar319,auVar38);
    auVar29 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    fVar178 = auVar98._0_4_;
    local_138._0_4_ = fVar178 + auVar242._0_4_;
    fVar194 = auVar98._4_4_;
    local_138._4_4_ = fVar194 + auVar242._4_4_;
    fVar138 = auVar98._8_4_;
    local_138._8_4_ = fVar138 + auVar242._8_4_;
    fVar195 = auVar98._12_4_;
    local_138._12_4_ = fVar195 + auVar242._12_4_;
    local_138._16_4_ = auVar242._16_4_ + 0.0;
    local_138._20_4_ = auVar242._20_4_ + 0.0;
    local_138._24_4_ = auVar242._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar22 = vsubps_avx(ZEXT1632(auVar98),auVar242);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    auVar39._4_4_ = fVar136 * fVar217;
    auVar39._0_4_ = fVar137 * fVar267;
    auVar39._8_4_ = fVar156 * fVar218;
    auVar39._12_4_ = fVar157 * fVar219;
    auVar39._16_4_ = fVar220 * 0.0;
    auVar39._20_4_ = fVar221 * 0.0;
    auVar39._24_4_ = fVar222 * 0.0;
    auVar39._28_4_ = auVar22._28_4_;
    auVar16 = vfnmadd231ps_fma(auVar39,local_98,auVar333);
    auVar40._4_4_ = fStack_154 * fVar217;
    auVar40._0_4_ = local_158 * fVar267;
    auVar40._8_4_ = fStack_150 * fVar218;
    auVar40._12_4_ = fStack_14c * fVar219;
    auVar40._16_4_ = fStack_148 * fVar220;
    auVar40._20_4_ = fStack_144 * fVar221;
    auVar40._24_4_ = fStack_140 * fVar222;
    auVar40._28_4_ = auVar29._28_4_;
    auVar55._4_4_ = fVar269;
    auVar55._0_4_ = fVar265;
    auVar55._8_4_ = fVar294;
    auVar55._12_4_ = fVar295;
    auVar55._16_4_ = fVar296;
    auVar55._20_4_ = fVar297;
    auVar55._24_4_ = fVar298;
    auVar55._28_4_ = 0x40400000;
    auVar95 = vfnmadd231ps_fma(auVar40,auVar333,auVar55);
    auVar41._4_4_ = local_178._4_4_ * fVar217;
    auVar41._0_4_ = local_178._0_4_ * fVar267;
    auVar41._8_4_ = local_178._8_4_ * fVar218;
    auVar41._12_4_ = local_178._12_4_ * fVar219;
    auVar41._16_4_ = local_178._16_4_ * fVar220;
    auVar41._20_4_ = local_178._20_4_ * fVar221;
    auVar41._24_4_ = local_178._24_4_ * fVar222;
    auVar41._28_4_ = fStack_13c;
    auVar80 = vfnmadd231ps_fma(auVar41,local_d8,auVar333);
    local_5d8._0_4_ = auVar27._0_4_;
    local_5d8._4_4_ = auVar27._4_4_;
    uStack_5d0._0_4_ = auVar27._8_4_;
    uStack_5d0._4_4_ = auVar27._12_4_;
    uStack_5c8._0_4_ = auVar27._16_4_;
    uStack_5c8._4_4_ = auVar27._20_4_;
    uStack_5c0._0_4_ = auVar27._24_4_;
    auVar42._4_4_ = fVar217 * (float)local_5d8._4_4_;
    auVar42._0_4_ = fVar267 * (float)local_5d8._0_4_;
    auVar42._8_4_ = fVar218 * (float)uStack_5d0;
    auVar42._12_4_ = fVar219 * uStack_5d0._4_4_;
    auVar42._16_4_ = fVar220 * (float)uStack_5c8;
    auVar42._20_4_ = fVar221 * uStack_5c8._4_4_;
    auVar42._24_4_ = fVar222 * (float)uStack_5c0;
    auVar42._28_4_ = local_178._28_4_;
    auVar77 = vfnmadd231ps_fma(auVar42,auVar26,auVar333);
    auVar61._4_4_ = fVar194 * fVar217;
    auVar61._0_4_ = fVar178 * fVar267;
    auVar61._8_4_ = fVar138 * fVar218;
    auVar61._12_4_ = fVar195 * fVar219;
    auVar61._16_4_ = fVar220 * 0.0;
    auVar61._20_4_ = fVar221 * 0.0;
    auVar61._24_4_ = fVar222 * 0.0;
    auVar61._28_4_ = DAT_0205d4a0._28_4_;
    auVar78 = vfnmadd231ps_fma(auVar61,auVar319,auVar333);
    auVar43._4_4_ = local_138._4_4_ * fVar217;
    auVar43._0_4_ = local_138._0_4_ * fVar267;
    auVar43._8_4_ = local_138._8_4_ * fVar218;
    auVar43._12_4_ = local_138._12_4_ * fVar219;
    auVar43._16_4_ = local_138._16_4_ * fVar220;
    auVar43._20_4_ = local_138._20_4_ * fVar221;
    auVar43._24_4_ = local_138._24_4_ * fVar222;
    auVar43._28_4_ = auVar26._28_4_;
    auVar121 = vfnmadd231ps_fma(auVar43,local_f8,auVar333);
    auVar44._4_4_ = local_118._4_4_ * fVar217;
    auVar44._0_4_ = local_118._0_4_ * fVar267;
    auVar44._8_4_ = local_118._8_4_ * fVar218;
    auVar44._12_4_ = local_118._12_4_ * fVar219;
    auVar44._16_4_ = local_118._16_4_ * fVar220;
    auVar44._20_4_ = local_118._20_4_ * fVar221;
    auVar44._24_4_ = local_118._24_4_ * fVar222;
    auVar44._28_4_ = local_d8._28_4_;
    auVar255 = vfnmadd231ps_fma(auVar44,auVar333,auVar29);
    auVar45._4_4_ = local_78._4_4_ * fVar217;
    auVar45._0_4_ = local_78._0_4_ * fVar267;
    auVar45._8_4_ = local_78._8_4_ * fVar218;
    auVar45._12_4_ = local_78._12_4_ * fVar219;
    auVar45._16_4_ = local_78._16_4_ * fVar220;
    auVar45._20_4_ = local_78._20_4_ * fVar221;
    auVar45._24_4_ = local_78._24_4_ * fVar222;
    auVar45._28_4_ = auVar97._28_4_ + auVar24._28_4_;
    auVar122 = vfnmadd231ps_fma(auVar45,auVar333,auVar28);
    auVar22 = vminps_avx(ZEXT1632(auVar16),ZEXT1632(auVar95));
    auVar97 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar95));
    auVar23 = vminps_avx(ZEXT1632(auVar80),ZEXT1632(auVar77));
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(ZEXT1632(auVar80),ZEXT1632(auVar77));
    auVar97 = vmaxps_avx(auVar97,auVar22);
    auVar24 = vminps_avx(ZEXT1632(auVar78),ZEXT1632(auVar121));
    auVar22 = vmaxps_avx(ZEXT1632(auVar78),ZEXT1632(auVar121));
    auVar25 = vminps_avx(ZEXT1632(auVar255),ZEXT1632(auVar122));
    auVar24 = vminps_avx(auVar24,auVar25);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(ZEXT1632(auVar255),ZEXT1632(auVar122));
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar97,auVar22);
    auVar60._4_4_ = fStack_194;
    auVar60._0_4_ = local_198;
    auVar60._8_4_ = fStack_190;
    auVar60._12_4_ = fStack_18c;
    auVar60._16_4_ = fStack_188;
    auVar60._20_4_ = fStack_184;
    auVar60._24_4_ = fStack_180;
    auVar60._28_4_ = fStack_17c;
    auVar97 = vcmpps_avx(auVar24,auVar60,2);
    auVar59._4_4_ = fStack_1b4;
    auVar59._0_4_ = local_1b8;
    auVar59._8_4_ = fStack_1b0;
    auVar59._12_4_ = fStack_1ac;
    auVar59._16_4_ = fStack_1a8;
    auVar59._20_4_ = fStack_1a4;
    auVar59._24_4_ = fStack_1a0;
    auVar59._28_4_ = fStack_19c;
    auVar22 = vcmpps_avx(auVar22,auVar59,5);
    auVar97 = vandps_avx(auVar22,auVar97);
    auVar22 = local_288 & auVar97;
    uVar65 = 0;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar22 = vsubps_avx(auVar26,local_98);
      auVar23 = vsubps_avx(auVar28,auVar319);
      fVar266 = auVar22._0_4_ + auVar23._0_4_;
      fVar268 = auVar22._4_4_ + auVar23._4_4_;
      fVar267 = auVar22._8_4_ + auVar23._8_4_;
      fVar217 = auVar22._12_4_ + auVar23._12_4_;
      fVar218 = auVar22._16_4_ + auVar23._16_4_;
      fVar219 = auVar22._20_4_ + auVar23._20_4_;
      fVar220 = auVar22._24_4_ + auVar23._24_4_;
      auVar24 = vsubps_avx(auVar27,local_b8);
      auVar25 = vsubps_avx(local_78,ZEXT1632(auVar98));
      auVar119._0_4_ = auVar24._0_4_ + auVar25._0_4_;
      auVar119._4_4_ = auVar24._4_4_ + auVar25._4_4_;
      auVar119._8_4_ = auVar24._8_4_ + auVar25._8_4_;
      auVar119._12_4_ = auVar24._12_4_ + auVar25._12_4_;
      auVar119._16_4_ = auVar24._16_4_ + auVar25._16_4_;
      auVar119._20_4_ = auVar24._20_4_ + auVar25._20_4_;
      auVar119._24_4_ = auVar24._24_4_ + auVar25._24_4_;
      fVar264 = auVar25._28_4_;
      auVar119._28_4_ = auVar24._28_4_ + fVar264;
      auVar342._0_4_ = fVar137 * fVar266;
      auVar342._4_4_ = fVar136 * fVar268;
      auVar342._8_4_ = fVar156 * fVar267;
      auVar342._12_4_ = fVar157 * fVar217;
      auVar342._16_4_ = fVar218 * 0.0;
      auVar342._20_4_ = fVar219 * 0.0;
      auVar342._24_4_ = fVar220 * 0.0;
      auVar342._28_4_ = 0;
      auVar78 = vfnmadd231ps_fma(auVar342,auVar119,local_98);
      auVar46._4_4_ = fVar268 * fStack_154;
      auVar46._0_4_ = fVar266 * local_158;
      auVar46._8_4_ = fVar267 * fStack_150;
      auVar46._12_4_ = fVar217 * fStack_14c;
      auVar46._16_4_ = fVar218 * fStack_148;
      auVar46._20_4_ = fVar219 * fStack_144;
      auVar46._24_4_ = fVar220 * fStack_140;
      auVar46._28_4_ = fVar264;
      auVar56._4_4_ = fVar269;
      auVar56._0_4_ = fVar265;
      auVar56._8_4_ = fVar294;
      auVar56._12_4_ = fVar295;
      auVar56._16_4_ = fVar296;
      auVar56._20_4_ = fVar297;
      auVar56._24_4_ = fVar298;
      auVar56._28_4_ = 0x40400000;
      auVar16 = vfnmadd213ps_fma(auVar56,auVar119,auVar46);
      auVar47._4_4_ = fVar268 * local_178._4_4_;
      auVar47._0_4_ = fVar266 * local_178._0_4_;
      auVar47._8_4_ = fVar267 * local_178._8_4_;
      auVar47._12_4_ = fVar217 * local_178._12_4_;
      auVar47._16_4_ = fVar218 * local_178._16_4_;
      auVar47._20_4_ = fVar219 * local_178._20_4_;
      auVar47._24_4_ = fVar220 * local_178._24_4_;
      auVar47._28_4_ = fVar264;
      auVar95 = vfnmadd213ps_fma(local_d8,auVar119,auVar47);
      auVar48._4_4_ = (float)local_5d8._4_4_ * fVar268;
      auVar48._0_4_ = (float)local_5d8._0_4_ * fVar266;
      auVar48._8_4_ = (float)uStack_5d0 * fVar267;
      auVar48._12_4_ = uStack_5d0._4_4_ * fVar217;
      auVar48._16_4_ = (float)uStack_5c8 * fVar218;
      auVar48._20_4_ = uStack_5c8._4_4_ * fVar219;
      auVar48._24_4_ = (float)uStack_5c0 * fVar220;
      auVar48._28_4_ = fVar264;
      auVar98 = vfnmadd231ps_fma(auVar48,auVar119,auVar26);
      auVar134._0_4_ = fVar178 * fVar266;
      auVar134._4_4_ = fVar194 * fVar268;
      auVar134._8_4_ = fVar138 * fVar267;
      auVar134._12_4_ = fVar195 * fVar217;
      auVar134._16_4_ = fVar218 * 0.0;
      auVar134._20_4_ = fVar219 * 0.0;
      auVar134._24_4_ = fVar220 * 0.0;
      auVar134._28_4_ = 0;
      auVar121 = vfnmadd231ps_fma(auVar134,auVar119,auVar319);
      auVar49._4_4_ = fVar268 * local_138._4_4_;
      auVar49._0_4_ = fVar266 * local_138._0_4_;
      auVar49._8_4_ = fVar267 * local_138._8_4_;
      auVar49._12_4_ = fVar217 * local_138._12_4_;
      auVar49._16_4_ = fVar218 * local_138._16_4_;
      auVar49._20_4_ = fVar219 * local_138._20_4_;
      auVar49._24_4_ = fVar220 * local_138._24_4_;
      auVar49._28_4_ = auVar27._28_4_;
      auVar80 = vfnmadd213ps_fma(local_f8,auVar119,auVar49);
      auVar50._4_4_ = fVar268 * local_118._4_4_;
      auVar50._0_4_ = fVar266 * local_118._0_4_;
      auVar50._8_4_ = fVar267 * local_118._8_4_;
      auVar50._12_4_ = fVar217 * local_118._12_4_;
      auVar50._16_4_ = fVar218 * local_118._16_4_;
      auVar50._20_4_ = fVar219 * local_118._20_4_;
      auVar50._24_4_ = fVar220 * local_118._24_4_;
      auVar50._28_4_ = auVar27._28_4_;
      auVar77 = vfnmadd213ps_fma(auVar29,auVar119,auVar50);
      auVar51._4_4_ = local_78._4_4_ * fVar268;
      auVar51._0_4_ = local_78._0_4_ * fVar266;
      auVar51._8_4_ = local_78._8_4_ * fVar267;
      auVar51._12_4_ = local_78._12_4_ * fVar217;
      auVar51._16_4_ = local_78._16_4_ * fVar218;
      auVar51._20_4_ = local_78._20_4_ * fVar219;
      auVar51._24_4_ = local_78._24_4_ * fVar220;
      auVar51._28_4_ = auVar22._28_4_ + auVar23._28_4_;
      auVar255 = vfnmadd231ps_fma(auVar51,auVar119,auVar28);
      auVar23 = vminps_avx(ZEXT1632(auVar78),ZEXT1632(auVar16));
      auVar22 = vmaxps_avx(ZEXT1632(auVar78),ZEXT1632(auVar16));
      auVar24 = vminps_avx(ZEXT1632(auVar95),ZEXT1632(auVar98));
      auVar24 = vminps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(ZEXT1632(auVar95),ZEXT1632(auVar98));
      auVar22 = vmaxps_avx(auVar22,auVar23);
      auVar25 = vminps_avx(ZEXT1632(auVar121),ZEXT1632(auVar80));
      auVar23 = vmaxps_avx(ZEXT1632(auVar121),ZEXT1632(auVar80));
      auVar26 = vminps_avx(ZEXT1632(auVar77),ZEXT1632(auVar255));
      auVar25 = vminps_avx(auVar25,auVar26);
      auVar25 = vminps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(ZEXT1632(auVar77),ZEXT1632(auVar255));
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(auVar22,auVar23);
      auVar22 = vcmpps_avx(auVar25,auVar60,2);
      auVar23 = vcmpps_avx(auVar23,auVar59,5);
      auVar22 = vandps_avx(auVar23,auVar22);
      auVar97 = vandps_avx(auVar97,local_288);
      auVar23 = auVar97 & auVar22;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar97 = vandps_avx(auVar22,auVar97);
        uVar65 = vmovmskps_avx(auVar97);
      }
    }
    if (uVar65 != 0) {
      auStack_3a8[uVar68] = uVar65;
      uVar196 = vmovlps_avx(local_328);
      *(undefined8 *)(&uStack_268 + uVar68 * 2) = uVar196;
      uVar73 = vmovlps_avx(local_658);
      auStack_58[uVar68] = uVar73;
      uVar68 = (ulong)((int)uVar68 + 1);
    }
    do {
      if ((int)uVar68 == 0) {
        uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar96._4_4_ = uVar76;
        auVar96._0_4_ = uVar76;
        auVar96._8_4_ = uVar76;
        auVar96._12_4_ = uVar76;
        auVar15 = vcmpps_avx(local_378,auVar96,2);
        uVar67 = vmovmskps_avx(auVar15);
        uVar64 = uVar64 & uVar64 + 0xf & uVar67;
        if (uVar64 == 0) {
          return;
        }
        goto LAB_017e7daa;
      }
      uVar66 = (int)uVar68 - 1;
      uVar69 = (ulong)uVar66;
      uVar72 = auStack_3a8[uVar69];
      uVar65 = (&uStack_268)[uVar69 * 2];
      fVar178 = afStack_264[uVar69 * 2];
      iVar30 = 0;
      for (uVar73 = (ulong)uVar72; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        iVar30 = iVar30 + 1;
      }
      uVar72 = uVar72 - 1 & uVar72;
      if (uVar72 == 0) {
        uVar68 = (ulong)uVar66;
      }
      local_658._8_8_ = 0;
      local_658._0_8_ = auStack_58[uVar69];
      auStack_3a8[uVar69] = uVar72;
      fVar194 = (float)(iVar30 + 1) * 0.14285715;
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * (float)iVar30 * 0.14285715)),
                                ZEXT416(uVar65),ZEXT416((uint)(1.0 - (float)iVar30 * 0.14285715)));
      auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * fVar194)),ZEXT416(uVar65),
                                ZEXT416((uint)(1.0 - fVar194)));
      auVar216._0_4_ = auVar16._0_4_;
      fVar194 = auVar95._0_4_;
      fVar178 = fVar194 - auVar216._0_4_;
      if (0.16666667 <= fVar178) break;
      auVar80 = vshufps_avx(local_658,local_658,0x50);
      auVar127._8_4_ = 0x3f800000;
      auVar127._0_8_ = &DAT_3f8000003f800000;
      auVar127._12_4_ = 0x3f800000;
      auVar77 = vsubps_avx(auVar127,auVar80);
      fVar138 = auVar80._0_4_;
      auVar148._0_4_ = fVar138 * fVar158;
      fVar195 = auVar80._4_4_;
      auVar148._4_4_ = fVar195 * fVar244;
      fVar137 = auVar80._8_4_;
      auVar148._8_4_ = fVar137 * fVar158;
      fVar136 = auVar80._12_4_;
      auVar148._12_4_ = fVar136 * fVar244;
      auVar166._0_4_ = fVar138 * fVar223;
      auVar166._4_4_ = fVar195 * fVar243;
      auVar166._8_4_ = fVar137 * fVar223;
      auVar166._12_4_ = fVar136 * fVar243;
      auVar187._0_4_ = fVar138 * fVar270;
      auVar187._4_4_ = fVar195 * fVar280;
      auVar187._8_4_ = fVar137 * fVar270;
      auVar187._12_4_ = fVar136 * fVar280;
      auVar110._0_4_ = fVar138 * fVar334;
      auVar110._4_4_ = fVar195 * fVar343;
      auVar110._8_4_ = fVar137 * fVar334;
      auVar110._12_4_ = fVar136 * fVar343;
      auVar80 = vfmadd231ps_fma(auVar148,auVar77,auVar210);
      auVar78 = vfmadd231ps_fma(auVar166,auVar77,auVar252);
      auVar98 = vfmadd231ps_fma(auVar187,auVar77,auVar285);
      auVar77 = vfmadd231ps_fma(auVar110,auVar77,auVar323);
      auVar135._16_16_ = auVar80;
      auVar135._0_16_ = auVar80;
      auVar154._16_16_ = auVar78;
      auVar154._0_16_ = auVar78;
      auVar177._16_16_ = auVar98;
      auVar177._0_16_ = auVar98;
      auVar216._4_4_ = auVar216._0_4_;
      auVar216._8_4_ = auVar216._0_4_;
      auVar216._12_4_ = auVar216._0_4_;
      auVar216._20_4_ = fVar194;
      auVar216._16_4_ = fVar194;
      auVar216._24_4_ = fVar194;
      auVar216._28_4_ = fVar194;
      auVar97 = vsubps_avx(auVar154,auVar135);
      auVar78 = vfmadd213ps_fma(auVar97,auVar216,auVar135);
      auVar97 = vsubps_avx(auVar177,auVar154);
      auVar121 = vfmadd213ps_fma(auVar97,auVar216,auVar154);
      auVar80 = vsubps_avx(auVar77,auVar98);
      auVar155._16_16_ = auVar80;
      auVar155._0_16_ = auVar80;
      auVar80 = vfmadd213ps_fma(auVar155,auVar216,auVar177);
      auVar97 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar78));
      auVar77 = vfmadd213ps_fma(auVar97,auVar216,ZEXT1632(auVar78));
      auVar97 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar121));
      auVar80 = vfmadd213ps_fma(auVar97,auVar216,ZEXT1632(auVar121));
      auVar97 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar77));
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar97,auVar216);
      fVar157 = auVar97._4_4_ * 3.0;
      fVar156 = fVar178 * 0.33333334;
      auVar286._0_8_ =
           CONCAT44(auVar123._4_4_ + fVar156 * fVar157,
                    auVar123._0_4_ + fVar156 * auVar97._0_4_ * 3.0);
      auVar286._8_4_ = auVar123._8_4_ + fVar156 * auVar97._8_4_ * 3.0;
      auVar286._12_4_ = auVar123._12_4_ + fVar156 * auVar97._12_4_ * 3.0;
      auVar77 = vshufpd_avx(auVar123,auVar123,3);
      auVar78 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar80 = vsubps_avx(auVar77,auVar123);
      auVar98 = vsubps_avx(auVar78,(undefined1  [16])0x0);
      auVar128._0_4_ = auVar80._0_4_ + auVar98._0_4_;
      auVar128._4_4_ = auVar80._4_4_ + auVar98._4_4_;
      auVar128._8_4_ = auVar80._8_4_ + auVar98._8_4_;
      auVar128._12_4_ = auVar80._12_4_ + auVar98._12_4_;
      auVar80 = vshufps_avx(auVar123,auVar123,0xb1);
      auVar98 = vshufps_avx(auVar286,auVar286,0xb1);
      auVar324._4_4_ = auVar128._0_4_;
      auVar324._0_4_ = auVar128._0_4_;
      auVar324._8_4_ = auVar128._0_4_;
      auVar324._12_4_ = auVar128._0_4_;
      auVar121 = vshufps_avx(auVar128,auVar128,0x55);
      fVar138 = auVar121._0_4_;
      auVar233._0_4_ = auVar80._0_4_ * fVar138;
      fVar195 = auVar121._4_4_;
      auVar233._4_4_ = auVar80._4_4_ * fVar195;
      fVar137 = auVar121._8_4_;
      auVar233._8_4_ = auVar80._8_4_ * fVar137;
      fVar136 = auVar121._12_4_;
      auVar233._12_4_ = auVar80._12_4_ * fVar136;
      auVar253._0_4_ = auVar98._0_4_ * fVar138;
      auVar253._4_4_ = auVar98._4_4_ * fVar195;
      auVar253._8_4_ = auVar98._8_4_ * fVar137;
      auVar253._12_4_ = auVar98._12_4_ * fVar136;
      auVar255 = vfmadd231ps_fma(auVar233,auVar324,auVar123);
      auVar122 = vfmadd231ps_fma(auVar253,auVar324,auVar286);
      auVar98 = vshufps_avx(auVar255,auVar255,0xe8);
      auVar121 = vshufps_avx(auVar122,auVar122,0xe8);
      auVar80 = vcmpps_avx(auVar98,auVar121,1);
      uVar65 = vextractps_avx(auVar80,0);
      auVar159 = auVar122;
      if ((uVar65 & 1) == 0) {
        auVar159 = auVar255;
      }
      auVar167._0_4_ = fVar156 * auVar97._16_4_ * 3.0;
      auVar167._4_4_ = fVar156 * fVar157;
      auVar167._8_4_ = fVar156 * auVar97._24_4_ * 3.0;
      auVar167._12_4_ = fVar156 * fVar194;
      auVar224 = vsubps_avx((undefined1  [16])0x0,auVar167);
      auVar168 = vshufps_avx(auVar224,auVar224,0xb1);
      auVar189 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar347._0_4_ = auVar168._0_4_ * fVar138;
      auVar347._4_4_ = auVar168._4_4_ * fVar195;
      auVar347._8_4_ = auVar168._8_4_ * fVar137;
      auVar347._12_4_ = auVar168._12_4_ * fVar136;
      auVar129._0_4_ = auVar189._0_4_ * fVar138;
      auVar129._4_4_ = auVar189._4_4_ * fVar195;
      auVar129._8_4_ = auVar189._8_4_ * fVar137;
      auVar129._12_4_ = auVar189._12_4_ * fVar136;
      auVar225 = vfmadd231ps_fma(auVar347,auVar324,auVar224);
      auVar245 = vfmadd231ps_fma(auVar129,(undefined1  [16])0x0,auVar324);
      auVar189 = vshufps_avx(auVar225,auVar225,0xe8);
      auVar197 = vshufps_avx(auVar245,auVar245,0xe8);
      auVar168 = vcmpps_avx(auVar189,auVar197,1);
      uVar65 = vextractps_avx(auVar168,0);
      auVar246 = auVar245;
      if ((uVar65 & 1) == 0) {
        auVar246 = auVar225;
      }
      auVar159 = vmaxss_avx(auVar246,auVar159);
      auVar98 = vminps_avx(auVar98,auVar121);
      auVar121 = vminps_avx(auVar189,auVar197);
      auVar121 = vminps_avx(auVar98,auVar121);
      auVar80 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vblendps_avx(auVar80,auVar168,2);
      auVar168 = vpslld_avx(auVar80,0x1f);
      auVar80 = vshufpd_avx(auVar122,auVar122,1);
      auVar80 = vinsertps_avx(auVar80,auVar245,0x9c);
      auVar98 = vshufpd_avx(auVar255,auVar255,1);
      auVar98 = vinsertps_avx(auVar98,auVar225,0x9c);
      auVar80 = vblendvps_avx(auVar98,auVar80,auVar168);
      auVar98 = vmovshdup_avx(auVar80);
      auVar80 = vmaxss_avx(auVar98,auVar80);
      fVar137 = auVar121._0_4_;
      auVar98 = vmovshdup_avx(auVar121);
      fVar195 = auVar80._0_4_;
      fVar138 = auVar159._0_4_;
      if ((0.0001 <= fVar137) || (fVar195 <= -0.0001)) {
        auVar255 = vcmpps_avx(auVar98,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar122 = vcmpps_avx(auVar121,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar255 = vorps_avx(auVar122,auVar255);
        if ((-0.0001 < fVar138 & auVar255[0]) != 0) goto LAB_017e9314;
        auVar255 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar80,5);
        auVar122 = vcmpps_avx(auVar98,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar255 = vorps_avx(auVar122,auVar255);
        if ((auVar255 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_017e9314;
LAB_017e9cb7:
        bVar52 = true;
      }
      else {
LAB_017e9314:
        auVar122 = vcmpps_avx(auVar121,_DAT_01feba10,1);
        auVar168 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar255 = vcmpss_avx(auVar159,ZEXT816(0) << 0x20,1);
        auVar188._8_4_ = 0x3f800000;
        auVar188._0_8_ = &DAT_3f8000003f800000;
        auVar188._12_4_ = 0x3f800000;
        auVar254._8_4_ = 0xbf800000;
        auVar254._0_8_ = 0xbf800000bf800000;
        auVar254._12_4_ = 0xbf800000;
        auVar255 = vblendvps_avx(auVar188,auVar254,auVar255);
        auVar122 = vblendvps_avx(auVar188,auVar254,auVar122);
        fVar136 = auVar122._0_4_;
        fVar156 = auVar255._0_4_;
        auVar255 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar136 == fVar156) && (!NAN(fVar136) && !NAN(fVar156))) {
          auVar255 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar189 = ZEXT816(0) << 0x20;
        if ((fVar136 == fVar156) && (!NAN(fVar136) && !NAN(fVar156))) {
          auVar168 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar122 = vmovshdup_avx(auVar122);
        fVar157 = auVar122._0_4_;
        if ((fVar136 != fVar157) || (NAN(fVar136) || NAN(fVar157))) {
          fVar136 = auVar98._0_4_;
          if ((fVar136 != fVar137) || (NAN(fVar136) || NAN(fVar137))) {
            auVar130._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
            auVar130._8_4_ = auVar121._8_4_ ^ 0x80000000;
            auVar130._12_4_ = auVar121._12_4_ ^ 0x80000000;
            auVar169._0_4_ = -fVar137 / (fVar136 - fVar137);
            auVar169._4_12_ = auVar130._4_12_;
            auVar98 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar169._0_4_)),auVar189,auVar169);
            auVar121 = auVar98;
          }
          else {
            auVar98 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar137 == 0.0) && (auVar98 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar137))) {
              auVar98 = ZEXT816(0);
            }
            auVar121 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar137 == 0.0) && (auVar121 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar137))) {
              auVar121 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar255 = vminss_avx(auVar255,auVar98);
          auVar168 = vmaxss_avx(auVar121,auVar168);
        }
        auVar80 = vcmpss_avx(auVar80,auVar189,1);
        auVar170._8_4_ = 0x3f800000;
        auVar170._0_8_ = &DAT_3f8000003f800000;
        auVar170._12_4_ = 0x3f800000;
        auVar311._8_4_ = 0xbf800000;
        auVar311._0_8_ = 0xbf800000bf800000;
        auVar311._12_4_ = 0xbf800000;
        auVar80 = vblendvps_avx(auVar170,auVar311,auVar80);
        fVar137 = auVar80._0_4_;
        auVar80 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar156 != fVar137) || (NAN(fVar156) || NAN(fVar137))) {
          if ((fVar195 != fVar138) || (NAN(fVar195) || NAN(fVar138))) {
            auVar131._0_8_ = auVar159._0_8_ ^ 0x8000000080000000;
            auVar131._8_4_ = auVar159._8_4_ ^ 0x80000000;
            auVar131._12_4_ = auVar159._12_4_ ^ 0x80000000;
            auVar171._0_4_ = -fVar138 / (fVar195 - fVar138);
            auVar171._4_12_ = auVar131._4_12_;
            auVar98 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar171._0_4_)),auVar189,auVar171);
            auVar121 = auVar98;
          }
          else {
            auVar98 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar138 == 0.0) && (auVar98 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar138))) {
              auVar98 = ZEXT816(0);
            }
            auVar121 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar138 == 0.0) && (auVar121 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar138))) {
              auVar121 = auVar80;
            }
          }
          auVar255 = vminss_avx(auVar255,auVar98);
          auVar168 = vmaxss_avx(auVar121,auVar168);
        }
        if ((fVar157 != fVar137) || (NAN(fVar157) || NAN(fVar137))) {
          auVar255 = vminss_avx(auVar255,auVar80);
          auVar168 = vmaxss_avx(auVar80,auVar168);
        }
        auVar98 = vmaxss_avx(auVar189,auVar255);
        auVar121 = vminss_avx(auVar168,auVar80);
        bVar52 = true;
        if (auVar98._0_4_ <= auVar121._0_4_) {
          auVar98 = vmaxss_avx(auVar189,ZEXT416((uint)(auVar98._0_4_ + -0.1)));
          auVar80 = vminss_avx(ZEXT416((uint)(auVar121._0_4_ + 0.1)),auVar80);
          auVar111._0_8_ = auVar123._0_8_;
          auVar111._8_8_ = auVar111._0_8_;
          auVar256._8_8_ = auVar286._0_8_;
          auVar256._0_8_ = auVar286._0_8_;
          auVar275._8_8_ = auVar224._0_8_;
          auVar275._0_8_ = auVar224._0_8_;
          auVar121 = vshufpd_avx(auVar286,auVar286,3);
          auVar255 = vshufpd_avx(auVar224,auVar224,3);
          auVar122 = vshufps_avx(auVar98,auVar80,0);
          auVar149._8_4_ = 0x3f800000;
          auVar149._0_8_ = &DAT_3f8000003f800000;
          auVar149._12_4_ = 0x3f800000;
          auVar123 = vsubps_avx(auVar149,auVar122);
          local_638._0_4_ = auVar77._0_4_;
          local_638._4_4_ = auVar77._4_4_;
          fStack_630 = auVar77._8_4_;
          fStack_62c = auVar77._12_4_;
          fVar138 = auVar122._0_4_;
          auVar150._0_4_ = fVar138 * (float)local_638._0_4_;
          fVar195 = auVar122._4_4_;
          auVar150._4_4_ = fVar195 * (float)local_638._4_4_;
          fVar137 = auVar122._8_4_;
          auVar150._8_4_ = fVar137 * fStack_630;
          fVar136 = auVar122._12_4_;
          auVar150._12_4_ = fVar136 * fStack_62c;
          auVar172._0_4_ = auVar121._0_4_ * fVar138;
          auVar172._4_4_ = auVar121._4_4_ * fVar195;
          auVar172._8_4_ = auVar121._8_4_ * fVar137;
          auVar172._12_4_ = auVar121._12_4_ * fVar136;
          auVar190._0_4_ = auVar255._0_4_ * fVar138;
          auVar190._4_4_ = auVar255._4_4_ * fVar195;
          auVar190._8_4_ = auVar255._8_4_ * fVar137;
          auVar190._12_4_ = auVar255._12_4_ * fVar136;
          local_5d8._0_4_ = auVar78._0_4_;
          local_5d8._4_4_ = auVar78._4_4_;
          uStack_5d0._0_4_ = auVar78._8_4_;
          uStack_5d0._4_4_ = auVar78._12_4_;
          auVar211._0_4_ = fVar138 * (float)local_5d8._0_4_;
          auVar211._4_4_ = fVar195 * (float)local_5d8._4_4_;
          auVar211._8_4_ = fVar137 * (float)uStack_5d0;
          auVar211._12_4_ = fVar136 * uStack_5d0._4_4_;
          auVar121 = vfmadd231ps_fma(auVar150,auVar123,auVar111);
          auVar255 = vfmadd231ps_fma(auVar172,auVar123,auVar256);
          auVar122 = vfmadd231ps_fma(auVar190,auVar123,auVar275);
          auVar123 = vfmadd231ps_fma(auVar211,auVar123,ZEXT816(0));
          auVar77 = vmovshdup_avx(local_658);
          auVar189 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar98._0_4_)),local_658,
                                     ZEXT416((uint)(1.0 - auVar98._0_4_)));
          auVar197 = vfmadd231ss_fma(ZEXT416((uint)(auVar77._0_4_ * auVar80._0_4_)),local_658,
                                     ZEXT416((uint)(1.0 - auVar80._0_4_)));
          fVar138 = 1.0 / fVar178;
          auVar80 = vsubps_avx(auVar255,auVar121);
          auVar234._0_4_ = auVar80._0_4_ * 3.0;
          auVar234._4_4_ = auVar80._4_4_ * 3.0;
          auVar234._8_4_ = auVar80._8_4_ * 3.0;
          auVar234._12_4_ = auVar80._12_4_ * 3.0;
          auVar80 = vsubps_avx(auVar122,auVar255);
          auVar257._0_4_ = auVar80._0_4_ * 3.0;
          auVar257._4_4_ = auVar80._4_4_ * 3.0;
          auVar257._8_4_ = auVar80._8_4_ * 3.0;
          auVar257._12_4_ = auVar80._12_4_ * 3.0;
          auVar80 = vsubps_avx(auVar123,auVar122);
          auVar276._0_4_ = auVar80._0_4_ * 3.0;
          auVar276._4_4_ = auVar80._4_4_ * 3.0;
          auVar276._8_4_ = auVar80._8_4_ * 3.0;
          auVar276._12_4_ = auVar80._12_4_ * 3.0;
          auVar77 = vminps_avx(auVar257,auVar276);
          auVar80 = vmaxps_avx(auVar257,auVar276);
          auVar77 = vminps_avx(auVar234,auVar77);
          auVar80 = vmaxps_avx(auVar234,auVar80);
          auVar78 = vshufpd_avx(auVar77,auVar77,3);
          auVar98 = vshufpd_avx(auVar80,auVar80,3);
          auVar77 = vminps_avx(auVar77,auVar78);
          auVar80 = vmaxps_avx(auVar80,auVar98);
          auVar258._0_4_ = auVar77._0_4_ * fVar138;
          auVar258._4_4_ = auVar77._4_4_ * fVar138;
          auVar258._8_4_ = auVar77._8_4_ * fVar138;
          auVar258._12_4_ = auVar77._12_4_ * fVar138;
          auVar235._0_4_ = fVar138 * auVar80._0_4_;
          auVar235._4_4_ = fVar138 * auVar80._4_4_;
          auVar235._8_4_ = fVar138 * auVar80._8_4_;
          auVar235._12_4_ = fVar138 * auVar80._12_4_;
          fVar138 = 1.0 / (auVar197._0_4_ - auVar189._0_4_);
          auVar80 = vshufpd_avx(auVar121,auVar121,3);
          auVar77 = vshufpd_avx(auVar255,auVar255,3);
          auVar78 = vshufpd_avx(auVar122,auVar122,3);
          auVar98 = vshufpd_avx(auVar123,auVar123,3);
          auVar80 = vsubps_avx(auVar80,auVar121);
          auVar121 = vsubps_avx(auVar77,auVar255);
          auVar255 = vsubps_avx(auVar78,auVar122);
          auVar98 = vsubps_avx(auVar98,auVar123);
          auVar77 = vminps_avx(auVar80,auVar121);
          auVar80 = vmaxps_avx(auVar80,auVar121);
          auVar78 = vminps_avx(auVar255,auVar98);
          auVar78 = vminps_avx(auVar77,auVar78);
          auVar77 = vmaxps_avx(auVar255,auVar98);
          auVar80 = vmaxps_avx(auVar80,auVar77);
          auVar301._0_4_ = fVar138 * auVar78._0_4_;
          auVar301._4_4_ = fVar138 * auVar78._4_4_;
          auVar301._8_4_ = fVar138 * auVar78._8_4_;
          auVar301._12_4_ = fVar138 * auVar78._12_4_;
          auVar287._0_4_ = fVar138 * auVar80._0_4_;
          auVar287._4_4_ = fVar138 * auVar80._4_4_;
          auVar287._8_4_ = fVar138 * auVar80._8_4_;
          auVar287._12_4_ = fVar138 * auVar80._12_4_;
          auVar98 = vinsertps_avx(auVar16,auVar189,0x10);
          auVar121 = vinsertps_avx(auVar95,auVar197,0x10);
          auVar94._0_4_ = (auVar98._0_4_ + auVar121._0_4_) * 0.5;
          auVar94._4_4_ = (auVar98._4_4_ + auVar121._4_4_) * 0.5;
          auVar94._8_4_ = (auVar98._8_4_ + auVar121._8_4_) * 0.5;
          auVar94._12_4_ = (auVar98._12_4_ + auVar121._12_4_) * 0.5;
          auVar151._4_4_ = auVar94._0_4_;
          auVar151._0_4_ = auVar94._0_4_;
          auVar151._8_4_ = auVar94._0_4_;
          auVar151._12_4_ = auVar94._0_4_;
          auVar80 = vfmadd213ps_fma(auVar15,auVar151,auVar17);
          auVar77 = vfmadd213ps_fma(local_298,auVar151,auVar18);
          auVar78 = vfmadd213ps_fma(local_2a8,auVar151,auVar184);
          auVar95 = vsubps_avx(auVar77,auVar80);
          auVar80 = vfmadd213ps_fma(auVar95,auVar151,auVar80);
          auVar95 = vsubps_avx(auVar78,auVar77);
          auVar95 = vfmadd213ps_fma(auVar95,auVar151,auVar77);
          auVar95 = vsubps_avx(auVar95,auVar80);
          auVar80 = vfmadd231ps_fma(auVar80,auVar95,auVar151);
          auVar152._0_8_ = CONCAT44(auVar95._4_4_ * 3.0,auVar95._0_4_ * 3.0);
          auVar152._8_4_ = auVar95._8_4_ * 3.0;
          auVar152._12_4_ = auVar95._12_4_ * 3.0;
          auVar277._8_8_ = auVar80._0_8_;
          auVar277._0_8_ = auVar80._0_8_;
          auVar95 = vshufpd_avx(auVar80,auVar80,3);
          auVar80 = vshufps_avx(auVar94,auVar94,0x55);
          auVar255 = vsubps_avx(auVar95,auVar277);
          auVar123 = vfmadd231ps_fma(auVar277,auVar80,auVar255);
          auVar325._8_8_ = auVar152._0_8_;
          auVar325._0_8_ = auVar152._0_8_;
          auVar95 = vshufpd_avx(auVar152,auVar152,3);
          auVar95 = vsubps_avx(auVar95,auVar325);
          auVar122 = vfmadd213ps_fma(auVar95,auVar80,auVar325);
          auVar80 = vmovshdup_avx(auVar122);
          auVar326._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
          auVar326._8_4_ = auVar80._8_4_ ^ 0x80000000;
          auVar326._12_4_ = auVar80._12_4_ ^ 0x80000000;
          auVar77 = vmovshdup_avx(auVar255);
          auVar95 = vunpcklps_avx(auVar77,auVar326);
          auVar78 = vshufps_avx(auVar95,auVar326,4);
          auVar348._0_8_ = auVar255._0_8_ ^ 0x8000000080000000;
          auVar348._8_4_ = auVar255._8_4_ ^ 0x80000000;
          auVar348._12_4_ = auVar255._12_4_ ^ 0x80000000;
          auVar95 = vmovlhps_avx(auVar348,auVar122);
          auVar95 = vshufps_avx(auVar95,auVar122,8);
          auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar255._0_4_)),auVar77,auVar122
                                   );
          auVar173._0_4_ = auVar80._0_4_;
          auVar173._4_4_ = auVar173._0_4_;
          auVar173._8_4_ = auVar173._0_4_;
          auVar173._12_4_ = auVar173._0_4_;
          auVar80 = vdivps_avx(auVar78,auVar173);
          auVar77 = vdivps_avx(auVar95,auVar173);
          fVar137 = auVar123._0_4_;
          fVar138 = auVar80._0_4_;
          auVar95 = vshufps_avx(auVar123,auVar123,0x55);
          fVar195 = auVar77._0_4_;
          local_5d8._4_4_ = fVar137 * auVar80._4_4_ + auVar95._4_4_ * auVar77._4_4_;
          local_5d8._0_4_ = fVar137 * fVar138 + auVar95._0_4_ * fVar195;
          uStack_5d0._0_4_ = fVar137 * auVar80._8_4_ + auVar95._8_4_ * auVar77._8_4_;
          uStack_5d0._4_4_ = fVar137 * auVar80._12_4_ + auVar95._12_4_ * auVar77._12_4_;
          auVar255 = vmovshdup_avx(auVar80);
          auVar95 = vinsertps_avx(auVar258,auVar301,0x1c);
          auVar339._0_4_ = auVar255._0_4_ * auVar95._0_4_;
          auVar339._4_4_ = auVar255._4_4_ * auVar95._4_4_;
          auVar339._8_4_ = auVar255._8_4_ * auVar95._8_4_;
          auVar339._12_4_ = auVar255._12_4_ * auVar95._12_4_;
          auVar78 = vinsertps_avx(auVar235,auVar287,0x1c);
          auVar312._0_4_ = auVar255._0_4_ * auVar78._0_4_;
          auVar312._4_4_ = auVar255._4_4_ * auVar78._4_4_;
          auVar312._8_4_ = auVar255._8_4_ * auVar78._8_4_;
          auVar312._12_4_ = auVar255._12_4_ * auVar78._12_4_;
          auVar159 = vminps_avx(auVar339,auVar312);
          auVar123 = vmaxps_avx(auVar312,auVar339);
          auVar255 = vinsertps_avx(auVar301,auVar258,0x4c);
          auVar168 = vmovshdup_avx(auVar77);
          auVar122 = vinsertps_avx(auVar287,auVar235,0x4c);
          auVar288._0_4_ = auVar168._0_4_ * auVar255._0_4_;
          auVar288._4_4_ = auVar168._4_4_ * auVar255._4_4_;
          auVar288._8_4_ = auVar168._8_4_ * auVar255._8_4_;
          auVar288._12_4_ = auVar168._12_4_ * auVar255._12_4_;
          auVar302._0_4_ = auVar168._0_4_ * auVar122._0_4_;
          auVar302._4_4_ = auVar168._4_4_ * auVar122._4_4_;
          auVar302._8_4_ = auVar168._8_4_ * auVar122._8_4_;
          auVar302._12_4_ = auVar168._12_4_ * auVar122._12_4_;
          auVar168 = vminps_avx(auVar288,auVar302);
          auVar112._0_4_ = auVar168._0_4_ + auVar159._0_4_;
          auVar112._4_4_ = auVar168._4_4_ + auVar159._4_4_;
          auVar112._8_4_ = auVar168._8_4_ + auVar159._8_4_;
          auVar112._12_4_ = auVar168._12_4_ + auVar159._12_4_;
          auVar159 = vmaxps_avx(auVar302,auVar288);
          auVar289._0_4_ = auVar123._0_4_ + auVar159._0_4_;
          auVar289._4_4_ = auVar123._4_4_ + auVar159._4_4_;
          auVar289._8_4_ = auVar123._8_4_ + auVar159._8_4_;
          auVar289._12_4_ = auVar123._12_4_ + auVar159._12_4_;
          auVar303._8_8_ = 0x3f80000000000000;
          auVar303._0_8_ = 0x3f80000000000000;
          auVar123 = vsubps_avx(auVar303,auVar289);
          auVar159 = vsubps_avx(auVar303,auVar112);
          auVar168 = vsubps_avx(auVar98,auVar94);
          auVar327._0_4_ = fVar138 * auVar95._0_4_;
          auVar327._4_4_ = fVar138 * auVar95._4_4_;
          auVar327._8_4_ = fVar138 * auVar95._8_4_;
          auVar327._12_4_ = fVar138 * auVar95._12_4_;
          auVar313._0_4_ = fVar138 * auVar78._0_4_;
          auVar313._4_4_ = fVar138 * auVar78._4_4_;
          auVar313._8_4_ = fVar138 * auVar78._8_4_;
          auVar313._12_4_ = fVar138 * auVar78._12_4_;
          auVar78 = vminps_avx(auVar327,auVar313);
          auVar95 = vmaxps_avx(auVar313,auVar327);
          auVar259._0_4_ = fVar195 * auVar255._0_4_;
          auVar259._4_4_ = fVar195 * auVar255._4_4_;
          auVar259._8_4_ = fVar195 * auVar255._8_4_;
          auVar259._12_4_ = fVar195 * auVar255._12_4_;
          auVar236._0_4_ = fVar195 * auVar122._0_4_;
          auVar236._4_4_ = fVar195 * auVar122._4_4_;
          auVar236._8_4_ = fVar195 * auVar122._8_4_;
          auVar236._12_4_ = fVar195 * auVar122._12_4_;
          auVar255 = vminps_avx(auVar259,auVar236);
          auVar328._0_4_ = auVar78._0_4_ + auVar255._0_4_;
          auVar328._4_4_ = auVar78._4_4_ + auVar255._4_4_;
          auVar328._8_4_ = auVar78._8_4_ + auVar255._8_4_;
          auVar328._12_4_ = auVar78._12_4_ + auVar255._12_4_;
          auVar255 = vsubps_avx(auVar121,auVar94);
          auVar78 = vmaxps_avx(auVar236,auVar259);
          fVar137 = auVar168._0_4_;
          auVar260._0_4_ = fVar137 * auVar123._0_4_;
          fVar136 = auVar168._4_4_;
          auVar260._4_4_ = fVar136 * auVar123._4_4_;
          fVar156 = auVar168._8_4_;
          auVar260._8_4_ = fVar156 * auVar123._8_4_;
          fVar157 = auVar168._12_4_;
          auVar260._12_4_ = fVar157 * auVar123._12_4_;
          auVar237._0_4_ = auVar95._0_4_ + auVar78._0_4_;
          auVar237._4_4_ = auVar95._4_4_ + auVar78._4_4_;
          auVar237._8_4_ = auVar95._8_4_ + auVar78._8_4_;
          auVar237._12_4_ = auVar95._12_4_ + auVar78._12_4_;
          auVar314._8_8_ = 0x3f800000;
          auVar314._0_8_ = 0x3f800000;
          auVar95 = vsubps_avx(auVar314,auVar237);
          auVar78 = vsubps_avx(auVar314,auVar328);
          auVar329._0_4_ = fVar137 * auVar159._0_4_;
          auVar329._4_4_ = fVar136 * auVar159._4_4_;
          auVar329._8_4_ = fVar156 * auVar159._8_4_;
          auVar329._12_4_ = fVar157 * auVar159._12_4_;
          fVar264 = auVar255._0_4_;
          auVar290._0_4_ = fVar264 * auVar123._0_4_;
          fVar266 = auVar255._4_4_;
          auVar290._4_4_ = fVar266 * auVar123._4_4_;
          fVar268 = auVar255._8_4_;
          auVar290._8_4_ = fVar268 * auVar123._8_4_;
          fVar265 = auVar255._12_4_;
          auVar290._12_4_ = fVar265 * auVar123._12_4_;
          auVar113._0_4_ = fVar264 * auVar159._0_4_;
          auVar113._4_4_ = fVar266 * auVar159._4_4_;
          auVar113._8_4_ = fVar268 * auVar159._8_4_;
          auVar113._12_4_ = fVar265 * auVar159._12_4_;
          auVar349._0_4_ = fVar137 * auVar95._0_4_;
          auVar349._4_4_ = fVar136 * auVar95._4_4_;
          auVar349._8_4_ = fVar156 * auVar95._8_4_;
          auVar349._12_4_ = fVar157 * auVar95._12_4_;
          auVar304._0_4_ = fVar137 * auVar78._0_4_;
          auVar304._4_4_ = fVar136 * auVar78._4_4_;
          auVar304._8_4_ = fVar156 * auVar78._8_4_;
          auVar304._12_4_ = fVar157 * auVar78._12_4_;
          auVar238._0_4_ = fVar264 * auVar95._0_4_;
          auVar238._4_4_ = fVar266 * auVar95._4_4_;
          auVar238._8_4_ = fVar268 * auVar95._8_4_;
          auVar238._12_4_ = fVar265 * auVar95._12_4_;
          auVar315._0_4_ = fVar264 * auVar78._0_4_;
          auVar315._4_4_ = fVar266 * auVar78._4_4_;
          auVar315._8_4_ = fVar268 * auVar78._8_4_;
          auVar315._12_4_ = fVar265 * auVar78._12_4_;
          auVar95 = vminps_avx(auVar349,auVar304);
          auVar78 = vminps_avx(auVar238,auVar315);
          auVar95 = vminps_avx(auVar95,auVar78);
          auVar78 = vmaxps_avx(auVar304,auVar349);
          auVar255 = vminps_avx(auVar260,auVar329);
          auVar122 = vminps_avx(auVar290,auVar113);
          auVar255 = vminps_avx(auVar255,auVar122);
          auVar95 = vhaddps_avx(auVar95,auVar255);
          auVar255 = vmaxps_avx(auVar315,auVar238);
          auVar78 = vmaxps_avx(auVar255,auVar78);
          auVar255 = vmaxps_avx(auVar329,auVar260);
          auVar122 = vmaxps_avx(auVar113,auVar290);
          auVar255 = vmaxps_avx(auVar122,auVar255);
          auVar78 = vhaddps_avx(auVar78,auVar255);
          auVar255 = vshufps_avx(auVar94,auVar94,0x54);
          auVar255 = vsubps_avx(auVar255,_local_5d8);
          auVar95 = vshufps_avx(auVar95,auVar95,0xe8);
          auVar78 = vshufps_avx(auVar78,auVar78,0xe8);
          auVar261._0_4_ = auVar255._0_4_ + auVar95._0_4_;
          auVar261._4_4_ = auVar255._4_4_ + auVar95._4_4_;
          auVar261._8_4_ = auVar255._8_4_ + auVar95._8_4_;
          auVar261._12_4_ = auVar255._12_4_ + auVar95._12_4_;
          auVar239._0_4_ = auVar255._0_4_ + auVar78._0_4_;
          auVar239._4_4_ = auVar255._4_4_ + auVar78._4_4_;
          auVar239._8_4_ = auVar255._8_4_ + auVar78._8_4_;
          auVar239._12_4_ = auVar255._12_4_ + auVar78._12_4_;
          auVar95 = vmaxps_avx(auVar98,auVar261);
          auVar78 = vminps_avx(auVar239,auVar121);
          auVar95 = vcmpps_avx(auVar78,auVar95,1);
          auVar95 = vshufps_avx(auVar95,auVar95,0x50);
          local_658 = vinsertps_avx(auVar189,ZEXT416((uint)auVar197._0_4_),0x10);
          if ((auVar95 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar95[0xf] < '\0') goto LAB_017e9cb7;
          bVar71 = 0;
          if ((auVar216._0_4_ < auVar261._0_4_) && (bVar71 = 0, auVar239._0_4_ < auVar121._0_4_)) {
            auVar78 = vmovshdup_avx(auVar261);
            auVar95 = vcmpps_avx(auVar239,auVar121,1);
            bVar71 = auVar95[4] & auVar189._0_4_ < auVar78._0_4_;
          }
          if (((3 < (uint)uVar68 || fVar178 < 0.001) | bVar71) == 1) {
            lVar70 = 200;
            do {
              fVar156 = auVar255._0_4_;
              fVar136 = 1.0 - fVar156;
              fVar178 = fVar136 * fVar136 * fVar136;
              fVar137 = fVar156 * 3.0 * fVar136 * fVar136;
              fVar136 = fVar136 * fVar156 * fVar156 * 3.0;
              auVar191._4_4_ = fVar178;
              auVar191._0_4_ = fVar178;
              auVar191._8_4_ = fVar178;
              auVar191._12_4_ = fVar178;
              auVar132._4_4_ = fVar137;
              auVar132._0_4_ = fVar137;
              auVar132._8_4_ = fVar137;
              auVar132._12_4_ = fVar137;
              auVar114._4_4_ = fVar136;
              auVar114._0_4_ = fVar136;
              auVar114._8_4_ = fVar136;
              auVar114._12_4_ = fVar136;
              fVar156 = fVar156 * fVar156 * fVar156;
              auVar212._0_4_ = (float)local_3b8._0_4_ * fVar156;
              auVar212._4_4_ = (float)local_3b8._4_4_ * fVar156;
              auVar212._8_4_ = fStack_3b0 * fVar156;
              auVar212._12_4_ = fStack_3ac * fVar156;
              auVar95 = vfmadd231ps_fma(auVar212,auVar184,auVar114);
              auVar95 = vfmadd231ps_fma(auVar95,auVar18,auVar132);
              auVar95 = vfmadd231ps_fma(auVar95,auVar17,auVar191);
              auVar115._8_8_ = auVar95._0_8_;
              auVar115._0_8_ = auVar95._0_8_;
              auVar95 = vshufpd_avx(auVar95,auVar95,3);
              auVar78 = vshufps_avx(auVar255,auVar255,0x55);
              auVar95 = vsubps_avx(auVar95,auVar115);
              auVar78 = vfmadd213ps_fma(auVar95,auVar78,auVar115);
              fVar178 = auVar78._0_4_;
              auVar95 = vshufps_avx(auVar78,auVar78,0x55);
              auVar116._0_4_ = fVar138 * fVar178 + fVar195 * auVar95._0_4_;
              auVar116._4_4_ = auVar80._4_4_ * fVar178 + auVar77._4_4_ * auVar95._4_4_;
              auVar116._8_4_ = auVar80._8_4_ * fVar178 + auVar77._8_4_ * auVar95._8_4_;
              auVar116._12_4_ = auVar80._12_4_ * fVar178 + auVar77._12_4_ * auVar95._12_4_;
              auVar255 = vsubps_avx(auVar255,auVar116);
              auVar95 = vandps_avx(auVar344,auVar78);
              auVar78 = vshufps_avx(auVar95,auVar95,0xf5);
              auVar95 = vmaxss_avx(auVar78,auVar95);
              if (auVar95._0_4_ < (float)local_2b8._0_4_) {
                local_218 = auVar255._0_4_;
                if ((0.0 <= local_218) && (local_218 <= 1.0)) {
                  auVar95 = vmovshdup_avx(auVar255);
                  fVar178 = auVar95._0_4_;
                  if ((0.0 <= fVar178) && (fVar178 <= 1.0)) {
                    auVar95 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar123 = vinsertps_avx(auVar95,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar95 = vdpps_avx(auVar123,local_3c8,0x7f);
                    auVar80 = vdpps_avx(auVar123,local_3d8,0x7f);
                    auVar77 = vdpps_avx(auVar123,local_2c8,0x7f);
                    auVar78 = vdpps_avx(auVar123,local_2d8,0x7f);
                    auVar98 = vdpps_avx(auVar123,local_2e8,0x7f);
                    auVar121 = vdpps_avx(auVar123,local_2f8,0x7f);
                    auVar122 = vdpps_avx(auVar123,local_308,0x7f);
                    auVar123 = vdpps_avx(auVar123,local_318,0x7f);
                    fVar138 = 1.0 - fVar178;
                    auVar95 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * auVar98._0_4_)),
                                              ZEXT416((uint)fVar138),auVar95);
                    auVar80 = vfmadd231ss_fma(ZEXT416((uint)(auVar121._0_4_ * fVar178)),
                                              ZEXT416((uint)fVar138),auVar80);
                    auVar77 = vfmadd231ss_fma(ZEXT416((uint)(auVar122._0_4_ * fVar178)),
                                              ZEXT416((uint)fVar138),auVar77);
                    auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar178 * auVar123._0_4_)),
                                              ZEXT416((uint)fVar138),auVar78);
                    fVar136 = 1.0 - local_218;
                    fVar138 = fVar136 * local_218 * local_218 * 3.0;
                    fVar157 = local_218 * local_218 * local_218;
                    auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar157 * auVar78._0_4_)),
                                              ZEXT416((uint)fVar138),auVar77);
                    fVar195 = local_218 * 3.0 * fVar136 * fVar136;
                    auVar80 = vfmadd231ss_fma(auVar77,ZEXT416((uint)fVar195),auVar80);
                    fVar137 = fVar136 * fVar136 * fVar136;
                    auVar95 = vfmadd231ss_fma(auVar80,ZEXT416((uint)fVar137),auVar95);
                    fVar156 = auVar95._0_4_;
                    if (((fVar75 <= fVar156) &&
                        (fVar264 = *(float *)(ray + k * 4 + 0x80), fVar156 <= fVar264)) &&
                       (pGVar8 = (context->scene->geometries).items[uVar67].ptr,
                       (pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                      auVar95 = vshufps_avx(auVar255,auVar255,0x55);
                      auVar278._8_4_ = 0x3f800000;
                      auVar278._0_8_ = &DAT_3f8000003f800000;
                      auVar278._12_4_ = 0x3f800000;
                      auVar80 = vsubps_avx(auVar278,auVar95);
                      fVar266 = auVar95._0_4_;
                      auVar291._0_4_ = fVar266 * (float)local_408._0_4_;
                      fVar268 = auVar95._4_4_;
                      auVar291._4_4_ = fVar268 * (float)local_408._4_4_;
                      fVar265 = auVar95._8_4_;
                      auVar291._8_4_ = fVar265 * fStack_400;
                      fVar267 = auVar95._12_4_;
                      auVar291._12_4_ = fVar267 * fStack_3fc;
                      local_4c8 = auVar106._0_4_;
                      fStack_4c4 = auVar106._4_4_;
                      fStack_4c0 = auVar106._8_4_;
                      fStack_4bc = auVar106._12_4_;
                      auVar305._0_4_ = fVar266 * local_4c8;
                      auVar305._4_4_ = fVar268 * fStack_4c4;
                      auVar305._8_4_ = fVar265 * fStack_4c0;
                      auVar305._12_4_ = fVar267 * fStack_4bc;
                      local_4d8 = auVar21._0_4_;
                      fStack_4d4 = auVar21._4_4_;
                      fStack_4d0 = auVar21._8_4_;
                      fStack_4cc = auVar21._12_4_;
                      auVar316._0_4_ = fVar266 * local_4d8;
                      auVar316._4_4_ = fVar268 * fStack_4d4;
                      auVar316._8_4_ = fVar265 * fStack_4d0;
                      auVar316._12_4_ = fVar267 * fStack_4cc;
                      local_4e8 = auVar124._0_4_;
                      fStack_4e4 = auVar124._4_4_;
                      fStack_4e0 = auVar124._8_4_;
                      fStack_4dc = auVar124._12_4_;
                      auVar330._0_4_ = fVar266 * local_4e8;
                      auVar330._4_4_ = fVar268 * fStack_4e4;
                      auVar330._8_4_ = fVar265 * fStack_4e0;
                      auVar330._12_4_ = fVar267 * fStack_4dc;
                      auVar77 = vfmadd231ps_fma(auVar291,auVar80,local_3e8);
                      auVar78 = vfmadd231ps_fma(auVar305,auVar80,auVar19);
                      auVar98 = vfmadd231ps_fma(auVar316,auVar80,local_3f8);
                      auVar121 = vfmadd231ps_fma(auVar330,auVar80,auVar20);
                      auVar80 = vsubps_avx(auVar78,auVar77);
                      auVar77 = vsubps_avx(auVar98,auVar78);
                      auVar78 = vsubps_avx(auVar121,auVar98);
                      auVar331._0_4_ = local_218 * auVar77._0_4_;
                      auVar331._4_4_ = local_218 * auVar77._4_4_;
                      auVar331._8_4_ = local_218 * auVar77._8_4_;
                      auVar331._12_4_ = local_218 * auVar77._12_4_;
                      auVar262._4_4_ = fVar136;
                      auVar262._0_4_ = fVar136;
                      auVar262._8_4_ = fVar136;
                      auVar262._12_4_ = fVar136;
                      auVar80 = vfmadd231ps_fma(auVar331,auVar262,auVar80);
                      auVar292._0_4_ = local_218 * auVar78._0_4_;
                      auVar292._4_4_ = local_218 * auVar78._4_4_;
                      auVar292._8_4_ = local_218 * auVar78._8_4_;
                      auVar292._12_4_ = local_218 * auVar78._12_4_;
                      auVar77 = vfmadd231ps_fma(auVar292,auVar262,auVar77);
                      auVar293._0_4_ = local_218 * auVar77._0_4_;
                      auVar293._4_4_ = local_218 * auVar77._4_4_;
                      auVar293._8_4_ = local_218 * auVar77._8_4_;
                      auVar293._12_4_ = local_218 * auVar77._12_4_;
                      auVar77 = vfmadd231ps_fma(auVar293,auVar262,auVar80);
                      auVar240._0_4_ = fVar157 * (float)local_368._0_4_;
                      auVar240._4_4_ = fVar157 * (float)local_368._4_4_;
                      auVar240._8_4_ = fVar157 * fStack_360;
                      auVar240._12_4_ = fVar157 * fStack_35c;
                      auVar174._4_4_ = fVar138;
                      auVar174._0_4_ = fVar138;
                      auVar174._8_4_ = fVar138;
                      auVar174._12_4_ = fVar138;
                      auVar80 = vfmadd132ps_fma(auVar174,auVar240,local_358);
                      auVar213._4_4_ = fVar195;
                      auVar213._0_4_ = fVar195;
                      auVar213._8_4_ = fVar195;
                      auVar213._12_4_ = fVar195;
                      auVar80 = vfmadd132ps_fma(auVar213,auVar80,local_348);
                      auVar241._0_4_ = auVar77._0_4_ * 3.0;
                      auVar241._4_4_ = auVar77._4_4_ * 3.0;
                      auVar241._8_4_ = auVar77._8_4_ * 3.0;
                      auVar241._12_4_ = auVar77._12_4_ * 3.0;
                      auVar192._4_4_ = fVar137;
                      auVar192._0_4_ = fVar137;
                      auVar192._8_4_ = fVar137;
                      auVar192._12_4_ = fVar137;
                      auVar77 = vfmadd132ps_fma(auVar192,auVar80,local_338);
                      auVar80 = vshufps_avx(auVar241,auVar241,0xc9);
                      auVar175._0_4_ = auVar77._0_4_ * auVar80._0_4_;
                      auVar175._4_4_ = auVar77._4_4_ * auVar80._4_4_;
                      auVar175._8_4_ = auVar77._8_4_ * auVar80._8_4_;
                      auVar175._12_4_ = auVar77._12_4_ * auVar80._12_4_;
                      auVar80 = vshufps_avx(auVar77,auVar77,0xc9);
                      auVar80 = vfmsub231ps_fma(auVar175,auVar241,auVar80);
                      local_228 = auVar80._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar156;
                        uVar76 = vextractps_avx(auVar80,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar76;
                        uVar76 = vextractps_avx(auVar80,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar76;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
                        *(float *)(ray + k * 4 + 0xf0) = local_218;
                        *(float *)(ray + k * 4 + 0x100) = fVar178;
                        *(uint *)(ray + k * 4 + 0x110) = uVar7;
                        *(uint *)(ray + k * 4 + 0x120) = uVar67;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar77 = vshufps_avx(auVar80,auVar80,0x55);
                        auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
                        local_248[0] = (RTCHitN)auVar77[0];
                        local_248[1] = (RTCHitN)auVar77[1];
                        local_248[2] = (RTCHitN)auVar77[2];
                        local_248[3] = (RTCHitN)auVar77[3];
                        local_248[4] = (RTCHitN)auVar77[4];
                        local_248[5] = (RTCHitN)auVar77[5];
                        local_248[6] = (RTCHitN)auVar77[6];
                        local_248[7] = (RTCHitN)auVar77[7];
                        local_248[8] = (RTCHitN)auVar77[8];
                        local_248[9] = (RTCHitN)auVar77[9];
                        local_248[10] = (RTCHitN)auVar77[10];
                        local_248[0xb] = (RTCHitN)auVar77[0xb];
                        local_248[0xc] = (RTCHitN)auVar77[0xc];
                        local_248[0xd] = (RTCHitN)auVar77[0xd];
                        local_248[0xe] = (RTCHitN)auVar77[0xe];
                        local_248[0xf] = (RTCHitN)auVar77[0xf];
                        local_238 = auVar80;
                        uStack_224 = local_228;
                        uStack_220 = local_228;
                        uStack_21c = local_228;
                        fStack_214 = local_218;
                        fStack_210 = local_218;
                        fStack_20c = local_218;
                        local_208 = auVar95;
                        local_1f8 = CONCAT44(uStack_394,local_398);
                        uStack_1f0 = CONCAT44(uStack_38c,uStack_390);
                        local_1e8._4_4_ = uStack_384;
                        local_1e8._0_4_ = local_388;
                        local_1e8._8_4_ = uStack_380;
                        local_1e8._12_4_ = uStack_37c;
                        vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                        uStack_1d4 = context->user->instID[0];
                        local_1d8 = uStack_1d4;
                        uStack_1d0 = uStack_1d4;
                        uStack_1cc = uStack_1d4;
                        uStack_1c8 = context->user->instPrimID[0];
                        uStack_1c4 = uStack_1c8;
                        uStack_1c0 = uStack_1c8;
                        uStack_1bc = uStack_1c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar156;
                        local_458 = *local_448;
                        uStack_450 = local_448[1];
                        local_438.valid = (int *)&local_458;
                        local_438.geometryUserPtr = pGVar8->userPtr;
                        local_438.context = context->user;
                        local_438.hit = local_248;
                        local_438.N = 4;
                        local_438.ray = (RTCRayN *)ray;
                        if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar8->intersectionFilterN)(&local_438);
                          auVar120._8_56_ = extraout_var;
                          auVar120._0_8_ = extraout_XMM1_Qa;
                          auVar80 = auVar120._0_16_;
                        }
                        auVar57._8_8_ = uStack_450;
                        auVar57._0_8_ = local_458;
                        if (auVar57 == (undefined1  [16])0x0) {
                          auVar95 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                          auVar95 = auVar95 ^ auVar80;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          auVar80 = vpcmpeqd_avx(auVar95,auVar95);
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var14)(&local_438);
                            auVar80 = vpcmpeqd_avx(auVar80,auVar80);
                          }
                          auVar58._8_8_ = uStack_450;
                          auVar58._0_8_ = local_458;
                          auVar77 = vpcmpeqd_avx(auVar58,_DAT_01feba10);
                          auVar95 = auVar77 ^ auVar80;
                          if (auVar58 != (undefined1  [16])0x0) {
                            auVar77 = auVar77 ^ auVar80;
                            auVar80 = vmaskmovps_avx(auVar77,*(undefined1 (*) [16])local_438.hit);
                            *(undefined1 (*) [16])(local_438.ray + 0xc0) = auVar80;
                            auVar80 = vmaskmovps_avx(auVar77,*(undefined1 (*) [16])
                                                              (local_438.hit + 0x10));
                            *(undefined1 (*) [16])(local_438.ray + 0xd0) = auVar80;
                            auVar80 = vmaskmovps_avx(auVar77,*(undefined1 (*) [16])
                                                              (local_438.hit + 0x20));
                            *(undefined1 (*) [16])(local_438.ray + 0xe0) = auVar80;
                            auVar80 = vmaskmovps_avx(auVar77,*(undefined1 (*) [16])
                                                              (local_438.hit + 0x30));
                            *(undefined1 (*) [16])(local_438.ray + 0xf0) = auVar80;
                            auVar80 = vmaskmovps_avx(auVar77,*(undefined1 (*) [16])
                                                              (local_438.hit + 0x40));
                            *(undefined1 (*) [16])(local_438.ray + 0x100) = auVar80;
                            auVar80 = vmaskmovps_avx(auVar77,*(undefined1 (*) [16])
                                                              (local_438.hit + 0x50));
                            *(undefined1 (*) [16])(local_438.ray + 0x110) = auVar80;
                            auVar80 = vmaskmovps_avx(auVar77,*(undefined1 (*) [16])
                                                              (local_438.hit + 0x60));
                            *(undefined1 (*) [16])(local_438.ray + 0x120) = auVar80;
                            auVar80 = vmaskmovps_avx(auVar77,*(undefined1 (*) [16])
                                                              (local_438.hit + 0x70));
                            *(undefined1 (*) [16])(local_438.ray + 0x130) = auVar80;
                            auVar80 = vmaskmovps_avx(auVar77,*(undefined1 (*) [16])
                                                              (local_438.hit + 0x80));
                            *(undefined1 (*) [16])(local_438.ray + 0x140) = auVar80;
                          }
                        }
                        auVar117._8_8_ = 0x100000001;
                        auVar117._0_8_ = 0x100000001;
                        if ((auVar117 & auVar95) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar264;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar70 = lVar70 + -1;
            } while (lVar70 != 0);
          }
          else {
            bVar52 = false;
          }
        }
      }
    } while (bVar52);
    local_328 = vinsertps_avx(auVar16,ZEXT416((uint)fVar194),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }